

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_tagliatelle_2021.h
# Opt level: O0

void __thiscall Tagliatelle<TTA>::PerformLabeling(Tagliatelle<TTA> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uchar *puVar6;
  uint *puVar7;
  uint *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  int iLabel_3;
  int iLabel_2;
  int c_5;
  uint *img_labels_row_5;
  uchar *img_row_5;
  int iLabel_1;
  int iLabel;
  int c_4;
  uint *img_labels_row_fol;
  uint *img_labels_row_4;
  uchar *img_row_fol_2;
  uchar *img_row_4;
  int r;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_4;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r_3;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int r_2;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  int r_1;
  Size local_90;
  Mat_<int> local_88;
  byte local_25;
  uint local_24;
  bool o_cols;
  int e_cols;
  uint uStack_18;
  bool o_rows;
  int e_rows;
  int w;
  int h;
  Tagliatelle<TTA> *this_local;
  
  e_rows = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uStack_18 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  e_cols = e_rows & 0xfffffffe;
  o_cols = e_rows % 2 == 1;
  local_24 = uStack_18 & 0xfffffffe;
  local_25 = (int)uStack_18 % 2 == 1;
  _w = this;
  cv::MatSize::operator()((MatSize *)&local_90);
  cv::Mat_<int>::Mat_(&local_88,&local_90);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_88)
  ;
  cv::Mat_<int>::~Mat_(&local_88);
  TTA::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1) /
             2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                   1) / 2) + 1);
  TTA::Setup();
  if (e_rows == 1) {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_1._4_4_ = -2;
LAB_003c4ce5:
    iVar4 = img_row_1._4_4_ + 2;
    if (iVar4 < (int)(uStack_18 - 2)) {
      if (puVar6[iVar4] == '\0') {
        if (puVar6[img_row_1._4_4_ + 3] != '\0') {
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
          img_row_1._4_4_ = iVar4;
          goto LAB_003c4df2;
        }
        puVar7[iVar4] = 0;
        img_row_1._4_4_ = iVar4;
      }
      else if (puVar6[img_row_1._4_4_ + 3] == '\0') {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
        img_row_1._4_4_ = iVar4;
      }
      else {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
        img_row_1._4_4_ = iVar4;
LAB_003c4df2:
        while( true ) {
          while( true ) {
            iVar4 = img_row_1._4_4_ + 2;
            if ((int)(uStack_18 - 2) <= iVar4) {
              if ((int)(uStack_18 - 2) < iVar4) {
                if (puVar6[iVar4] == '\0') {
                  puVar7[iVar4] = 0;
                }
                else {
                  puVar7[iVar4] = puVar7[img_row_1._4_4_];
                }
              }
              else if (puVar6[iVar4] == '\0') {
                if (puVar6[img_row_1._4_4_ + 3] == '\0') {
                  puVar7[iVar4] = 0;
                }
                else {
                  uVar5 = TTA::NewLabel();
                  puVar7[iVar4] = uVar5;
                }
              }
              else if (puVar6[img_row_1._4_4_ + 3] == '\0') {
                puVar7[iVar4] = puVar7[img_row_1._4_4_];
              }
              else {
                puVar7[iVar4] = puVar7[img_row_1._4_4_];
              }
              goto LAB_003d7cc1;
            }
            if (puVar6[iVar4] == '\0') break;
            if (puVar6[img_row_1._4_4_ + 3] == '\0') {
              puVar7[iVar4] = puVar7[img_row_1._4_4_];
              img_row_1._4_4_ = iVar4;
              goto LAB_003c4ce5;
            }
            puVar7[iVar4] = puVar7[img_row_1._4_4_];
            img_row_1._4_4_ = iVar4;
          }
          if (puVar6[img_row_1._4_4_ + 3] == '\0') break;
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
          img_row_1._4_4_ = iVar4;
        }
        puVar7[iVar4] = 0;
        img_row_1._4_4_ = iVar4;
      }
      goto LAB_003c4ce5;
    }
    if ((int)(uStack_18 - 2) < iVar4) {
      if (puVar6[iVar4] == '\0') {
        puVar7[iVar4] = 0;
      }
      else {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
      }
    }
    else if (puVar6[iVar4] == '\0') {
      if (puVar6[img_row_1._4_4_ + 3] == '\0') {
        puVar7[iVar4] = 0;
      }
      else {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
      }
    }
    else if (puVar6[img_row_1._4_4_ + 3] == '\0') {
      uVar5 = TTA::NewLabel();
      puVar7[iVar4] = uVar5;
    }
    else {
      uVar5 = TTA::NewLabel();
      puVar7[iVar4] = uVar5;
    }
  }
  else {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_2._4_4_ = -2;
LAB_003c519c:
    iVar4 = img_row_2._4_4_ + 2;
    if (iVar4 < (int)(uStack_18 - 2)) {
      if (puVar6[iVar4] == '\0') {
        if (puVar6[iVar4 + lVar1] == '\0') {
          if (puVar6[img_row_2._4_4_ + 3] == '\0') {
            if (puVar6[(img_row_2._4_4_ + 3) + lVar1] == '\0') {
              puVar7[iVar4] = 0;
              img_row_2._4_4_ = iVar4;
              goto LAB_003c519c;
            }
            uVar5 = TTA::NewLabel();
            puVar7[iVar4] = uVar5;
            img_row_2._4_4_ = iVar4;
          }
          else {
            uVar5 = TTA::NewLabel();
            puVar7[iVar4] = uVar5;
            img_row_2._4_4_ = iVar4;
          }
        }
        else {
          if (puVar6[img_row_2._4_4_ + 3] == '\0') {
            uVar5 = TTA::NewLabel();
            puVar7[iVar4] = uVar5;
            img_row_2._4_4_ = iVar4;
            goto LAB_003c5504;
          }
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
          img_row_2._4_4_ = iVar4;
        }
      }
      else {
        if (puVar6[img_row_2._4_4_ + 3] == '\0') {
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
          img_row_2._4_4_ = iVar4;
          goto LAB_003c5504;
        }
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
        img_row_2._4_4_ = iVar4;
      }
LAB_003c532f:
      do {
        iVar4 = img_row_2._4_4_ + 2;
        if ((int)(uStack_18 - 2) <= iVar4) {
          if ((int)(uStack_18 - 2) < iVar4) {
            if (puVar6[iVar4] == '\0') {
              if (puVar6[iVar4 + lVar1] == '\0') {
                puVar7[iVar4] = 0;
              }
              else {
                puVar7[iVar4] = puVar7[img_row_2._4_4_];
              }
            }
            else {
              puVar7[iVar4] = puVar7[img_row_2._4_4_];
            }
          }
          else if (puVar6[iVar4] == '\0') {
            if (puVar6[iVar4 + lVar1] == '\0') {
              if (puVar6[img_row_2._4_4_ + 3] == '\0') {
                if (puVar6[(img_row_2._4_4_ + 3) + lVar1] == '\0') {
                  puVar7[iVar4] = 0;
                }
                else {
                  uVar5 = TTA::NewLabel();
                  puVar7[iVar4] = uVar5;
                }
              }
              else {
                uVar5 = TTA::NewLabel();
                puVar7[iVar4] = uVar5;
              }
            }
            else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
              puVar7[iVar4] = puVar7[img_row_2._4_4_];
            }
            else {
              puVar7[iVar4] = puVar7[img_row_2._4_4_];
            }
          }
          else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
            puVar7[iVar4] = puVar7[img_row_2._4_4_];
          }
          else {
            puVar7[iVar4] = puVar7[img_row_2._4_4_];
          }
          goto LAB_003c5f63;
        }
        if (puVar6[iVar4] == '\0') {
          if (puVar6[iVar4 + lVar1] == '\0') {
            if (puVar6[img_row_2._4_4_ + 3] == '\0') {
              if (puVar6[(img_row_2._4_4_ + 3) + lVar1] == '\0') {
                puVar7[iVar4] = 0;
                img_row_2._4_4_ = iVar4;
                goto LAB_003c519c;
              }
              uVar5 = TTA::NewLabel();
              puVar7[iVar4] = uVar5;
              img_row_2._4_4_ = iVar4;
            }
            else {
              uVar5 = TTA::NewLabel();
              puVar7[iVar4] = uVar5;
              img_row_2._4_4_ = iVar4;
            }
          }
          else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
            puVar7[iVar4] = puVar7[img_row_2._4_4_];
            img_row_2._4_4_ = iVar4;
LAB_003c5504:
            while( true ) {
              while( true ) {
                while( true ) {
                  iVar4 = img_row_2._4_4_ + 2;
                  if ((int)(uStack_18 - 2) <= iVar4) {
                    if ((int)(uStack_18 - 2) < iVar4) {
                      if (puVar6[iVar4] == '\0') {
                        if (puVar6[iVar4 + lVar1] == '\0') {
                          puVar7[iVar4] = 0;
                        }
                        else if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                        }
                        else {
                          puVar7[iVar4] = puVar7[img_row_2._4_4_];
                        }
                      }
                      else if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                        uVar5 = TTA::NewLabel();
                        puVar7[iVar4] = uVar5;
                      }
                      else {
                        puVar7[iVar4] = puVar7[img_row_2._4_4_];
                      }
                    }
                    else if (puVar6[iVar4] == '\0') {
                      if (puVar6[iVar4 + lVar1] == '\0') {
                        if (puVar6[img_row_2._4_4_ + 3] == '\0') {
                          if (puVar6[(img_row_2._4_4_ + 3) + lVar1] == '\0') {
                            puVar7[iVar4] = 0;
                          }
                          else {
                            uVar5 = TTA::NewLabel();
                            puVar7[iVar4] = uVar5;
                          }
                        }
                        else {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                        }
                      }
                      else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
                        if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                        }
                        else {
                          puVar7[iVar4] = puVar7[img_row_2._4_4_];
                        }
                      }
                      else if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                        uVar5 = TTA::NewLabel();
                        puVar7[iVar4] = uVar5;
                      }
                      else {
                        puVar7[iVar4] = puVar7[img_row_2._4_4_];
                      }
                    }
                    else if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                      if (puVar6[img_row_2._4_4_ + 3] == '\0') {
                        uVar5 = TTA::NewLabel();
                        puVar7[iVar4] = uVar5;
                      }
                      else {
                        uVar5 = TTA::NewLabel();
                        puVar7[iVar4] = uVar5;
                      }
                    }
                    else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
                      puVar7[iVar4] = puVar7[img_row_2._4_4_];
                    }
                    else {
                      puVar7[iVar4] = puVar7[img_row_2._4_4_];
                    }
                    goto LAB_003c5f63;
                  }
                  if (puVar6[iVar4] != '\0') break;
                  if (puVar6[iVar4 + lVar1] == '\0') {
                    if (puVar6[img_row_2._4_4_ + 3] != '\0') {
                      uVar5 = TTA::NewLabel();
                      puVar7[iVar4] = uVar5;
                      img_row_2._4_4_ = iVar4;
                      goto LAB_003c532f;
                    }
                    if (puVar6[(img_row_2._4_4_ + 3) + lVar1] == '\0') {
                      puVar7[iVar4] = 0;
                      img_row_2._4_4_ = iVar4;
                      goto LAB_003c519c;
                    }
                    uVar5 = TTA::NewLabel();
                    puVar7[iVar4] = uVar5;
                    img_row_2._4_4_ = iVar4;
                    goto LAB_003c532f;
                  }
                  if (puVar6[img_row_2._4_4_ + 3] != '\0') {
                    if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                      uVar5 = TTA::NewLabel();
                      puVar7[iVar4] = uVar5;
                      img_row_2._4_4_ = iVar4;
                    }
                    else {
                      puVar7[iVar4] = puVar7[img_row_2._4_4_];
                      img_row_2._4_4_ = iVar4;
                    }
                    goto LAB_003c532f;
                  }
                  if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                    uVar5 = TTA::NewLabel();
                    puVar7[iVar4] = uVar5;
                    img_row_2._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar7[img_row_2._4_4_];
                    img_row_2._4_4_ = iVar4;
                  }
                }
                if (puVar6[(img_row_2._4_4_ + 1) + lVar1] == '\0') break;
                if (puVar6[img_row_2._4_4_ + 3] != '\0') {
                  puVar7[iVar4] = puVar7[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar4;
                  goto LAB_003c532f;
                }
                puVar7[iVar4] = puVar7[img_row_2._4_4_];
                img_row_2._4_4_ = iVar4;
              }
              if (puVar6[img_row_2._4_4_ + 3] != '\0') break;
              uVar5 = TTA::NewLabel();
              puVar7[iVar4] = uVar5;
              img_row_2._4_4_ = iVar4;
            }
            uVar5 = TTA::NewLabel();
            puVar7[iVar4] = uVar5;
            img_row_2._4_4_ = iVar4;
          }
          else {
            puVar7[iVar4] = puVar7[img_row_2._4_4_];
            img_row_2._4_4_ = iVar4;
          }
        }
        else {
          if (puVar6[img_row_2._4_4_ + 3] == '\0') {
            puVar7[iVar4] = puVar7[img_row_2._4_4_];
            img_row_2._4_4_ = iVar4;
            goto LAB_003c5504;
          }
          puVar7[iVar4] = puVar7[img_row_2._4_4_];
          img_row_2._4_4_ = iVar4;
        }
      } while( true );
    }
    if ((int)(uStack_18 - 2) < iVar4) {
      if (puVar6[iVar4] == '\0') {
        if (puVar6[iVar4 + lVar1] == '\0') {
          puVar7[iVar4] = 0;
        }
        else {
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
        }
      }
      else {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
      }
    }
    else if (puVar6[iVar4] == '\0') {
      if (puVar6[iVar4 + lVar1] == '\0') {
        if (puVar6[img_row_2._4_4_ + 3] == '\0') {
          if (puVar6[(img_row_2._4_4_ + 3) + lVar1] == '\0') {
            puVar7[iVar4] = 0;
          }
          else {
            uVar5 = TTA::NewLabel();
            puVar7[iVar4] = uVar5;
          }
        }
        else {
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
        }
      }
      else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
      }
      else {
        uVar5 = TTA::NewLabel();
        puVar7[iVar4] = uVar5;
      }
    }
    else if (puVar6[img_row_2._4_4_ + 3] == '\0') {
      uVar5 = TTA::NewLabel();
      puVar7[iVar4] = uVar5;
    }
    else {
      uVar5 = TTA::NewLabel();
      puVar7[iVar4] = uVar5;
    }
LAB_003c5f63:
    for (img_row_2._0_4_ = 2; (int)img_row_2 < e_cols; img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar6 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      puVar9 = puVar6 + -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                     field_0x48;
      lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar10 = puVar6 + **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                     field_0x48;
      puVar7 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,(int)img_row_2);
      puVar8 = (uint *)((long)puVar7 +
                       (-**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_
                                     )->field_0x48 -
                       **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)
                                   ->field_0x48));
      img_row_3._4_4_ = 0;
      if ((int)(uStack_18 - 2) < 1) {
        if ((int)(uStack_18 - 2) < 0) {
          if (*puVar6 == '\0') {
            if (*puVar10 == '\0') {
              *puVar7 = 0;
            }
            else {
              uVar5 = TTA::NewLabel();
              *puVar7 = uVar5;
            }
          }
          else if (*puVar9 == '\0') {
            uVar5 = TTA::NewLabel();
            *puVar7 = uVar5;
          }
          else {
            *puVar7 = *puVar8;
          }
        }
        else if (*puVar6 == '\0') {
          if (*puVar10 == '\0') {
            if (puVar6[1] == '\0') {
              if (puVar10[1] == '\0') {
                *puVar7 = 0;
              }
              else {
                uVar5 = TTA::NewLabel();
                *puVar7 = uVar5;
              }
            }
            else if (puVar9[1] == '\0') {
              if (*puVar9 == '\0') {
                uVar5 = TTA::NewLabel();
                *puVar7 = uVar5;
              }
              else {
                *puVar7 = *puVar8;
              }
            }
            else {
              *puVar7 = *puVar8;
            }
          }
          else if (puVar6[1] == '\0') {
            uVar5 = TTA::NewLabel();
            *puVar7 = uVar5;
          }
          else if (puVar9[1] == '\0') {
            if (*puVar9 == '\0') {
              uVar5 = TTA::NewLabel();
              *puVar7 = uVar5;
            }
            else {
              *puVar7 = *puVar8;
            }
          }
          else {
            *puVar7 = *puVar8;
          }
        }
        else if (puVar9[1] == '\0') {
          if (*puVar9 == '\0') {
            uVar5 = TTA::NewLabel();
            *puVar7 = uVar5;
          }
          else {
            *puVar7 = *puVar8;
          }
        }
        else {
          *puVar7 = *puVar8;
        }
      }
      else {
        if (*puVar6 == '\0') {
          if (*puVar10 == '\0') {
            if (puVar6[1] == '\0') {
              if (puVar10[1] == '\0') {
                *puVar7 = 0;
                goto LAB_003c6680;
              }
              uVar5 = TTA::NewLabel();
              *puVar7 = uVar5;
              goto LAB_003c6f3e;
            }
            if (puVar9[1] != '\0') {
              *puVar7 = *puVar8;
              goto LAB_003c8b4b;
            }
            if (puVar9[2] == '\0') {
              if (*puVar9 == '\0') {
                uVar5 = TTA::NewLabel();
                *puVar7 = uVar5;
                goto LAB_003c7a5b;
              }
              *puVar7 = *puVar8;
              goto LAB_003c7f21;
            }
            if (*puVar9 == '\0') {
              *puVar7 = puVar8[2];
              goto LAB_003c8690;
            }
            if (puVar9[1 - lVar1] == '\0') {
              uVar5 = TTA::Merge(*puVar8,puVar8[2]);
              *puVar7 = uVar5;
              goto LAB_003c8690;
            }
            *puVar7 = *puVar8;
            goto LAB_003c8690;
          }
          if (puVar6[1] == '\0') {
            uVar5 = TTA::NewLabel();
            *puVar7 = uVar5;
            goto LAB_003c9309;
          }
          if (puVar9[1] != '\0') {
            *puVar7 = *puVar8;
            goto LAB_003c8b4b;
          }
          if (puVar9[2] == '\0') {
            if (*puVar9 == '\0') {
              uVar5 = TTA::NewLabel();
              *puVar7 = uVar5;
              goto LAB_003c7a5b;
            }
            *puVar7 = *puVar8;
            goto LAB_003c7f21;
          }
          if (*puVar9 == '\0') {
            *puVar7 = puVar8[2];
            goto LAB_003c8690;
          }
          if (puVar9[1 - lVar1] == '\0') {
            uVar5 = TTA::Merge(*puVar8,puVar8[2]);
            *puVar7 = uVar5;
            goto LAB_003c8690;
          }
          *puVar7 = *puVar8;
          goto LAB_003c8690;
        }
        if (puVar9[1] == '\0') {
          if (puVar6[1] == '\0') {
            if (*puVar9 == '\0') {
              uVar5 = TTA::NewLabel();
              *puVar7 = uVar5;
              goto LAB_003cadc0;
            }
            *puVar7 = *puVar8;
            goto LAB_003cb977;
          }
          if (puVar9[2] == '\0') {
            if (*puVar9 == '\0') {
              uVar5 = TTA::NewLabel();
              *puVar7 = uVar5;
              goto LAB_003c7a5b;
            }
            *puVar7 = *puVar8;
            goto LAB_003c7f21;
          }
          if (*puVar9 == '\0') {
            *puVar7 = puVar8[2];
            goto LAB_003c8690;
          }
          if (puVar9[1 - lVar1] == '\0') {
            uVar5 = TTA::Merge(*puVar8,puVar8[2]);
            *puVar7 = uVar5;
            goto LAB_003c8690;
          }
          *puVar7 = *puVar8;
          goto LAB_003c8690;
        }
        *puVar7 = *puVar8;
        img_row_3._4_4_ = 0;
LAB_003cca9c:
        iVar4 = img_row_3._4_4_ + 2;
        if (iVar4 < (int)(uStack_18 - 2)) {
          if (puVar6[iVar4] == '\0') {
            if (puVar10[iVar4] == '\0') {
              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                  puVar7[iVar4] = 0;
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003c6680;
                }
                uVar5 = TTA::NewLabel();
                puVar7[iVar4] = uVar5;
                img_row_3._4_4_ = iVar4;
                goto LAB_003c6f3e;
              }
              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                puVar7[iVar4] = puVar8[iVar4];
                img_row_3._4_4_ = iVar4;
                goto LAB_003c8b4b;
              }
              if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                if (puVar9[iVar4] == '\0') {
                  uVar5 = TTA::NewLabel();
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003c7a5b;
                }
                puVar7[iVar4] = puVar8[iVar4];
                img_row_3._4_4_ = iVar4;
                goto LAB_003c7f21;
              }
              if (puVar9[iVar4] == '\0') {
                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                img_row_3._4_4_ = iVar4;
              }
              else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]);
                puVar7[iVar4] = uVar5;
                img_row_3._4_4_ = iVar4;
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
                img_row_3._4_4_ = iVar4;
              }
            }
            else {
              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                if (puVar10[img_row_3._4_4_ + 1] != '\0') {
                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003c9309;
                }
                if (puVar6[img_row_3._4_4_ + 1] == '\0') {
                  uVar5 = TTA::NewLabel();
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003c9309;
                }
                puVar7[iVar4] = puVar7[img_row_3._4_4_];
                img_row_3._4_4_ = iVar4;
                goto LAB_003c9309;
              }
              if (puVar6[img_row_3._4_4_ + 1] == '\0') {
                if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c8b4b;
                  }
                  if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                    if (puVar9[iVar4] == '\0') {
                      uVar5 = TTA::NewLabel();
                      puVar7[iVar4] = uVar5;
                      img_row_3._4_4_ = iVar4;
                      goto LAB_003c7a5b;
                    }
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c7f21;
                  }
                  if (puVar9[iVar4] == '\0') {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                    img_row_3._4_4_ = iVar4;
                  }
                  else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                  }
                }
                else {
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                    if (puVar9[iVar4] != '\0') {
                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar4;
                      goto LAB_003c8b4b;
                    }
                    if (puVar9[iVar4 - lVar1] == '\0') {
                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                      puVar7[iVar4] = uVar5;
                      img_row_3._4_4_ = iVar4;
                      goto LAB_003c8b4b;
                    }
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c8b4b;
                  }
                  if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                    if (puVar9[iVar4] == '\0') {
                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar4;
                      goto LAB_003c7a5b;
                    }
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c7f21;
                  }
                  if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    if (puVar9[iVar4] == '\0') {
                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
                      puVar7[iVar4] = uVar5;
                      img_row_3._4_4_ = iVar4;
                    }
                    else {
                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[img_row_3._4_4_ + 4]);
                      puVar7[iVar4] = uVar5;
                      img_row_3._4_4_ = iVar4;
                    }
                  }
                  else if (puVar9[iVar4] == '\0') {
                    if (puVar9[iVar4 - lVar1] == '\0') {
                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                      puVar7[iVar4] = uVar5;
                      img_row_3._4_4_ = iVar4;
                    }
                    else {
                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar4;
                    }
                  }
                  else {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                  }
                }
              }
              else {
                if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                  if (puVar9[iVar4] != '\0') {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c8b4b;
                  }
                  if (puVar9[iVar4 - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c8b4b;
                  }
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003c8b4b;
                }
                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003ca4be;
                }
                if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else if (puVar9[iVar4] == '\0') {
                  if (puVar9[iVar4 - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                  }
                }
                else {
                  puVar7[iVar4] = puVar8[iVar4];
                  img_row_3._4_4_ = iVar4;
                }
              }
            }
LAB_003c8690:
            do {
              iVar4 = img_row_3._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= iVar4) {
                if ((int)(uStack_18 - 2) < iVar4) {
LAB_003cf632:
                  img_row_3._4_4_ = iVar4;
                  if (puVar6[img_row_3._4_4_] == '\0') {
                    if (puVar10[img_row_3._4_4_] == '\0') {
                      puVar7[img_row_3._4_4_] = 0;
                    }
                    else {
                      puVar7[img_row_3._4_4_] = puVar7[img_row_3._4_4_ + -2];
                    }
                  }
                  else {
                    puVar7[img_row_3._4_4_] = puVar7[img_row_3._4_4_ + -2];
                  }
                }
                else if (puVar6[iVar4] == '\0') {
                  if (puVar10[iVar4] == '\0') {
                    if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                      if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                        puVar7[iVar4] = 0;
                      }
                      else {
                        uVar5 = TTA::NewLabel();
                        puVar7[iVar4] = uVar5;
                      }
                    }
                    else {
                      puVar7[iVar4] = puVar8[iVar4];
                    }
                  }
                  else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                  }
                  else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                  }
                  else {
                    puVar7[iVar4] = puVar8[iVar4];
                  }
                }
                else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                }
                else {
                  puVar7[iVar4] = puVar8[iVar4];
                }
                goto LAB_003d42bf;
              }
              if (puVar6[iVar4] == '\0') {
                if (puVar10[iVar4] == '\0') {
                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                    if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                      puVar7[iVar4] = 0;
                      img_row_3._4_4_ = iVar4;
                      goto LAB_003c6680;
                    }
                    uVar5 = TTA::NewLabel();
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c6f3e;
                  }
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c8b4b;
                  }
                  if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c7f21;
                  }
                  if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                  }
                }
                else {
                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c9309;
                  }
                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c8b4b;
                  }
                  if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003ca4be;
                  }
                  if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar8[iVar4];
                    img_row_3._4_4_ = iVar4;
                  }
                }
              }
              else {
                if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                  puVar7[iVar4] = puVar8[iVar4];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003cca9c;
                }
                if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003cde33;
                }
                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
LAB_003ca4be:
                  do {
                    iVar4 = img_row_3._4_4_ + 2;
                    if ((int)(uStack_18 - 2) <= iVar4) {
                      if ((int)(uStack_18 - 2) < iVar4) goto LAB_003cf632;
                      if (puVar6[iVar4] == '\0') {
                        if (puVar10[iVar4] == '\0') {
                          if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                              puVar7[iVar4] = 0;
                            }
                            else {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                            }
                          }
                          else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            uVar5 = TTA::NewLabel();
                            puVar7[iVar4] = uVar5;
                          }
                          else {
                            puVar7[iVar4] = puVar8[iVar4];
                          }
                        }
                        else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = puVar7[img_row_3._4_4_];
                        }
                        else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = puVar7[img_row_3._4_4_];
                        }
                        else if (puVar9[iVar4 - lVar1] == '\0') {
                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                          puVar7[iVar4] = uVar5;
                        }
                        else if (puVar9[img_row_3._4_4_] == '\0') {
                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                          puVar7[iVar4] = uVar5;
                        }
                        else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                          puVar7[iVar4] = uVar5;
                        }
                        else {
                          puVar7[iVar4] = puVar8[img_row_3._4_4_];
                        }
                      }
                      else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                        puVar7[iVar4] = puVar7[img_row_3._4_4_];
                      }
                      else if (puVar9[iVar4 - lVar1] == '\0') {
                        uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                        puVar7[iVar4] = uVar5;
                      }
                      else if (puVar9[img_row_3._4_4_] == '\0') {
                        uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                        puVar7[iVar4] = uVar5;
                      }
                      else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                        puVar7[iVar4] = uVar5;
                      }
                      else {
                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                      }
                      goto LAB_003d42bf;
                    }
                    if (puVar6[iVar4] == '\0') {
                      if (puVar10[iVar4] == '\0') {
                        if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                          if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                            puVar7[iVar4] = 0;
                            img_row_3._4_4_ = iVar4;
                            goto LAB_003c6680;
                          }
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                          img_row_3._4_4_ = iVar4;
                          goto LAB_003c6f3e;
                        }
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                            uVar5 = TTA::NewLabel();
                            puVar7[iVar4] = uVar5;
                            img_row_3._4_4_ = iVar4;
                            goto LAB_003c7a5b;
                          }
                          puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                          img_row_3._4_4_ = iVar4;
                          goto LAB_003c8690;
                        }
                        puVar7[iVar4] = puVar8[iVar4];
                        img_row_3._4_4_ = iVar4;
                      }
                      else {
                        if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = puVar7[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar4;
                          goto LAB_003c9309;
                        }
                        if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                          if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                            if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]
                                                );
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else if (puVar9[iVar4 - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else if (puVar9[img_row_3._4_4_] == '\0') {
                              uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else {
                              puVar7[iVar4] = puVar8[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar4;
                            }
                            goto LAB_003c8690;
                          }
                          puVar7[iVar4] = puVar7[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar4;
                          goto LAB_003ca4be;
                        }
                        if (puVar9[iVar4 - lVar1] == '\0') {
                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                          puVar7[iVar4] = uVar5;
                          img_row_3._4_4_ = iVar4;
                        }
                        else if (puVar9[img_row_3._4_4_] == '\0') {
                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                          puVar7[iVar4] = uVar5;
                          img_row_3._4_4_ = iVar4;
                        }
                        else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                          puVar7[iVar4] = uVar5;
                          img_row_3._4_4_ = iVar4;
                        }
                        else {
                          puVar7[iVar4] = puVar8[img_row_3._4_4_];
                          img_row_3._4_4_ = iVar4;
                        }
                      }
LAB_003c8b4b:
                      do {
                        iVar4 = img_row_3._4_4_ + 2;
                        if ((int)(uStack_18 - 2) <= iVar4) {
                          if ((int)(uStack_18 - 2) < iVar4) goto LAB_003cf632;
                          if (puVar6[iVar4] == '\0') {
                            if (puVar10[iVar4] == '\0') {
                              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                  puVar7[iVar4] = 0;
                                }
                                else {
                                  uVar5 = TTA::NewLabel();
                                  puVar7[iVar4] = uVar5;
                                }
                              }
                              else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar9[iVar4] == '\0') {
                                  uVar5 = TTA::NewLabel();
                                  puVar7[iVar4] = uVar5;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[iVar4];
                                }
                              }
                              else {
                                puVar7[iVar4] = puVar8[iVar4];
                              }
                            }
                            else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                            }
                            else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                            }
                            else if (puVar9[iVar4] == '\0') {
                              if (puVar9[iVar4 - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                puVar7[iVar4] = uVar5;
                              }
                              else {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                              }
                            }
                            else {
                              puVar7[iVar4] = puVar8[iVar4];
                            }
                          }
                          else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                          }
                          else if (puVar9[iVar4] == '\0') {
                            if (puVar9[iVar4 - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                              puVar7[iVar4] = uVar5;
                            }
                            else {
                              puVar7[iVar4] = puVar8[img_row_3._4_4_];
                            }
                          }
                          else {
                            puVar7[iVar4] = puVar8[iVar4];
                          }
                          goto LAB_003d42bf;
                        }
                        if (puVar6[iVar4] != '\0') {
                          if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                            if (puVar9[iVar4] == '\0') {
                              if (puVar9[iVar4 - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                puVar7[iVar4] = uVar5;
                                img_row_3._4_4_ = iVar4;
                              }
                              else {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar4;
                              }
                            }
                            else {
                              puVar7[iVar4] = puVar8[iVar4];
                              img_row_3._4_4_ = iVar4;
                            }
                            goto LAB_003cca9c;
                          }
                          if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar4;
                            goto LAB_003cde33;
                          }
                          if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar4;
                            goto LAB_003ca4be;
                          }
                          if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
                            puVar7[iVar4] = uVar5;
                            img_row_3._4_4_ = iVar4;
                          }
                          else if (puVar9[iVar4] == '\0') {
                            if (puVar9[iVar4 - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else {
                              puVar7[iVar4] = puVar8[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar4;
                            }
                          }
                          else {
                            puVar7[iVar4] = puVar8[iVar4];
                            img_row_3._4_4_ = iVar4;
                          }
                          goto LAB_003c8690;
                        }
                        if (puVar10[iVar4] == '\0') {
                          if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                              puVar7[iVar4] = 0;
                              img_row_3._4_4_ = iVar4;
                              goto LAB_003c6680;
                            }
                            uVar5 = TTA::NewLabel();
                            puVar7[iVar4] = uVar5;
                            img_row_3._4_4_ = iVar4;
                            goto LAB_003c6f3e;
                          }
                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                              if (puVar9[iVar4] == '\0') {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                img_row_3._4_4_ = iVar4;
                              }
                              else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]);
                                puVar7[iVar4] = uVar5;
                                img_row_3._4_4_ = iVar4;
                              }
                              else {
                                puVar7[iVar4] = puVar8[iVar4];
                                img_row_3._4_4_ = iVar4;
                              }
                              goto LAB_003c8690;
                            }
                            if (puVar9[iVar4] == '\0') {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                              goto LAB_003c7a5b;
                            }
                            puVar7[iVar4] = puVar8[iVar4];
                            img_row_3._4_4_ = iVar4;
LAB_003c7f21:
                            iVar4 = img_row_3._4_4_ + 2;
                            if ((int)(uStack_18 - 2) <= iVar4) {
                              if ((int)(uStack_18 - 2) < iVar4) goto LAB_003cf632;
                              if (puVar6[iVar4] == '\0') {
                                if (puVar10[iVar4] == '\0') {
                                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                      puVar7[iVar4] = 0;
                                    }
                                    else {
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                    }
                                  }
                                  else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[iVar4];
                                  }
                                }
                                else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                }
                                else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                }
                                else if (puVar9[iVar4 - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                }
                              }
                              else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                puVar7[iVar4] = puVar7[img_row_3._4_4_];
                              }
                              else if (puVar9[iVar4 - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                puVar7[iVar4] = uVar5;
                              }
                              else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                puVar7[iVar4] = uVar5;
                              }
                              else {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                              }
                              goto LAB_003d42bf;
                            }
                            if (puVar6[iVar4] != '\0') {
                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                if (puVar9[iVar4 - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar4;
                                }
                                goto LAB_003cca9c;
                              }
                              if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar4;
                                  goto LAB_003ca4be;
                                }
                                if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                     puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else if (puVar9[iVar4 - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar4;
                                }
                                goto LAB_003c8690;
                              }
                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar4;
LAB_003cde33:
                              iVar4 = img_row_3._4_4_ + 2;
                              if (iVar4 < (int)(uStack_18 - 2)) {
                                if (puVar6[iVar4] == '\0') {
                                  if (puVar10[iVar4] == '\0') {
                                    if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                      if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                        puVar7[iVar4] = 0;
                                        img_row_3._4_4_ = iVar4;
                                        goto LAB_003c6680;
                                      }
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c6f3e;
                                    }
                                    if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                      puVar7[iVar4] = puVar8[iVar4];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c8b4b;
                                    }
                                    if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                      if (puVar9[iVar4] == '\0') {
                                        puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                        uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]
                                                          );
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else {
                                        puVar7[iVar4] = puVar8[iVar4];
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      goto LAB_003c8690;
                                    }
                                    if (puVar9[iVar4] != '\0') {
                                      puVar7[iVar4] = puVar8[iVar4];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c7f21;
                                    }
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                    img_row_3._4_4_ = iVar4;
                                  }
                                  else {
                                    if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                      if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                        uVar5 = TTA::NewLabel();
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                        goto LAB_003c9309;
                                      }
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c9309;
                                    }
                                    if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                      if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                        puVar7[iVar4] = puVar8[iVar4];
                                        img_row_3._4_4_ = iVar4;
                                        goto LAB_003c8b4b;
                                      }
                                      if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                        if (puVar9[iVar4] == '\0') {
                                          puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],
                                                             puVar8[img_row_3._4_4_ + 4]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else {
                                          puVar7[iVar4] = puVar8[iVar4];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c8690;
                                      }
                                      if (puVar9[iVar4] != '\0') {
                                        puVar7[iVar4] = puVar8[iVar4];
                                        img_row_3._4_4_ = iVar4;
                                        goto LAB_003c7f21;
                                      }
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else {
                                      if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                        if (puVar9[img_row_3._4_4_] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[iVar4] == '\0') {
                                          if (puVar9[iVar4 - lVar1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]
                                                              );
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else {
                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar4;
                                          }
                                        }
                                        else {
                                          puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c8b4b;
                                      }
                                      if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                        if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                          if (puVar9[iVar4] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else if (puVar9[img_row_3._4_4_] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[iVar4],
                                                               puVar8[img_row_3._4_4_ + 4]);
                                            uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]
                                                              );
                                            uVar5 = TTA::Merge(uVar5,puVar8[img_row_3._4_4_ + 4]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar8[img_row_3._4_4_ + 4]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                        }
                                        else if (puVar9[img_row_3._4_4_] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[iVar4] == '\0') {
                                          if (puVar9[iVar4 - lVar1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]
                                                              );
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else {
                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar4;
                                          }
                                        }
                                        else {
                                          puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c8690;
                                      }
                                      if (puVar9[iVar4] != '\0') {
                                        if (puVar9[img_row_3._4_4_] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else {
                                          puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c7f21;
                                      }
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                    }
                                  }
                                }
                                else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                    puVar7[iVar4] = puVar8[iVar4];
                                    img_row_3._4_4_ = iVar4;
                                    goto LAB_003cca9c;
                                  }
                                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar9[iVar4] == '\0') {
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003cadc0;
                                    }
                                    puVar7[iVar4] = puVar8[iVar4];
                                    img_row_3._4_4_ = iVar4;
                                    goto LAB_003cb977;
                                  }
                                  if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                    if (puVar9[iVar4] == '\0') {
                                      puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else {
                                      puVar7[iVar4] = puVar8[iVar4];
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    goto LAB_003c8690;
                                  }
                                  if (puVar9[iVar4] != '\0') {
                                    puVar7[iVar4] = puVar8[iVar4];
                                    img_row_3._4_4_ = iVar4;
                                    goto LAB_003c7f21;
                                  }
                                  uVar5 = TTA::NewLabel();
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else {
                                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                    if (puVar9[img_row_3._4_4_] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else if (puVar9[iVar4] == '\0') {
                                      if (puVar9[iVar4 - lVar1] == '\0') {
                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else {
                                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar4;
                                      }
                                    }
                                    else {
                                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    goto LAB_003cca9c;
                                  }
                                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar9[iVar4] == '\0') {
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003cadc0;
                                    }
                                    if (puVar9[img_row_3._4_4_] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003cb977;
                                    }
                                    if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003cb977;
                                    }
                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                    img_row_3._4_4_ = iVar4;
                                    goto LAB_003cb977;
                                  }
                                  if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                    if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                      if (puVar9[iVar4] == '\0') {
                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                           puVar7[img_row_3._4_4_]);
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else if (puVar9[img_row_3._4_4_] == '\0') {
                                        uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]
                                                          );
                                        uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                        uVar5 = TTA::Merge(uVar5,puVar8[img_row_3._4_4_ + 4]);
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else {
                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                           puVar8[img_row_3._4_4_ + 4]);
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                    }
                                    else if (puVar9[img_row_3._4_4_] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else if (puVar9[iVar4] == '\0') {
                                      if (puVar9[iVar4 - lVar1] == '\0') {
                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                        puVar7[iVar4] = uVar5;
                                        img_row_3._4_4_ = iVar4;
                                      }
                                      else {
                                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                        img_row_3._4_4_ = iVar4;
                                      }
                                    }
                                    else {
                                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    goto LAB_003c8690;
                                  }
                                  if (puVar9[iVar4] != '\0') {
                                    if (puVar9[img_row_3._4_4_] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else {
                                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    goto LAB_003c7f21;
                                  }
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar4;
                                }
LAB_003c7a5b:
                                do {
                                  iVar4 = img_row_3._4_4_ + 2;
                                  if ((int)(uStack_18 - 2) <= iVar4) {
                                    if ((int)(uStack_18 - 2) < iVar4) goto LAB_003cf632;
                                    if (puVar6[iVar4] == '\0') {
                                      if (puVar10[iVar4] == '\0') {
                                        if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                            puVar7[iVar4] = 0;
                                          }
                                          else {
                                            uVar5 = TTA::NewLabel();
                                            puVar7[iVar4] = uVar5;
                                          }
                                        }
                                        else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                          uVar5 = TTA::NewLabel();
                                          puVar7[iVar4] = uVar5;
                                        }
                                        else {
                                          puVar7[iVar4] = puVar8[iVar4];
                                        }
                                      }
                                      else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                        puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      }
                                      else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                        puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      }
                                      else {
                                        uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                        puVar7[iVar4] = uVar5;
                                      }
                                    }
                                    else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                    }
                                    else {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                    }
                                    goto LAB_003d42bf;
                                  }
                                  if (puVar6[iVar4] != '\0') {
                                    if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003cca9c;
                                    }
                                    if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003cde33;
                                    }
                                    if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003ca4be;
                                    }
                                    if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                         puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    goto LAB_003c8690;
                                  }
                                  if (puVar10[iVar4] != '\0') {
                                    if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c9309;
                                    }
                                    if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c8b4b;
                                    }
                                    if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003ca4be;
                                    }
                                    if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                         puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    else {
                                      uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    }
                                    goto LAB_003c8690;
                                  }
                                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                      puVar7[iVar4] = 0;
                                      img_row_3._4_4_ = iVar4;
                                      goto LAB_003c6680;
                                    }
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                    img_row_3._4_4_ = iVar4;
LAB_003c6f3e:
                                    do {
                                      iVar4 = img_row_3._4_4_ + 2;
                                      if ((int)(uStack_18 - 2) <= iVar4) {
                                        if ((int)(uStack_18 - 2) < iVar4) {
                                          if (puVar6[iVar4] == '\0') {
                                            if (puVar10[iVar4] == '\0') {
                                              puVar7[iVar4] = 0;
                                            }
                                            else {
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            }
                                          }
                                          else if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                            if (puVar9[iVar4] == '\0') {
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            }
                                            else {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                            }
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                          }
                                        }
                                        else if (puVar6[iVar4] == '\0') {
                                          if (puVar10[iVar4] == '\0') {
                                            if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                              if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                                puVar7[iVar4] = 0;
                                              }
                                              else {
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                              }
                                            }
                                            else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                              if (puVar9[iVar4] == '\0') {
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                              }
                                            }
                                            else {
                                              puVar7[iVar4] = puVar8[iVar4];
                                            }
                                          }
                                          else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                          }
                                          else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                            if (puVar9[iVar4] == '\0') {
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            }
                                            else {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                            }
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]
                                                              );
                                            puVar7[iVar4] = uVar5;
                                          }
                                        }
                                        else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                            if (puVar9[iVar4] == '\0') {
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            }
                                            else {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                            }
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                          }
                                        }
                                        else if (puVar9[iVar4] == '\0') {
                                          if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]
                                                              );
                                            puVar7[iVar4] = uVar5;
                                          }
                                          else if (puVar9[iVar4 - lVar1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]
                                                              );
                                            uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                          }
                                        }
                                        else {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                        }
                                        goto LAB_003d42bf;
                                      }
                                      if (puVar6[iVar4] != '\0') {
                                        if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                          if (puVar9[iVar4] == '\0') {
                                            if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else if (puVar9[iVar4 - lVar1] == '\0') {
                                              uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                 puVar8[iVar4]);
                                              uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else {
                                              uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]
                                                              );
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          goto LAB_003cca9c;
                                        }
                                        if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                          if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                            if (puVar9[iVar4] != '\0') {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003cb977;
                                            }
                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003cadc0;
                                          }
                                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                             puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003cde33;
                                        }
                                        if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                          if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003ca4be;
                                          }
                                          if (puVar9[iVar4] == '\0') {
                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003c7a5b;
                                          }
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003c7f21;
                                        }
                                        if (puVar9[iVar4] == '\0') {
                                          if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar8[img_row_3._4_4_ + 4]);
                                            uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else if (puVar9[iVar4 - lVar1] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]
                                                              );
                                            uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                        }
                                        else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],
                                                             puVar8[img_row_3._4_4_ + 4]);
                                          uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c8690;
                                      }
                                      if (puVar10[iVar4] != '\0') {
                                        if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                          puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003c9309;
                                        }
                                        if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003c8b4b;
                                        }
                                        if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                          if (puVar9[iVar4] == '\0') {
                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003c7a5b;
                                          }
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003c7f21;
                                        }
                                        if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                          if (puVar9[iVar4] == '\0') {
                                            uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                               puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                          else {
                                            uVar5 = TTA::Merge(puVar8[iVar4],
                                                               puVar8[img_row_3._4_4_ + 4]);
                                            uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                          }
                                        }
                                        else {
                                          uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c8690;
                                      }
                                      if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                        if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                          puVar7[iVar4] = puVar8[iVar4];
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003c8b4b;
                                        }
                                        if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                          if (puVar9[iVar4] == '\0') {
                                            uVar5 = TTA::NewLabel();
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003c7a5b;
                                          }
                                          puVar7[iVar4] = puVar8[iVar4];
                                          img_row_3._4_4_ = iVar4;
                                          goto LAB_003c7f21;
                                        }
                                        if (puVar9[iVar4] == '\0') {
                                          puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                          uVar5 = TTA::Merge(puVar8[iVar4],
                                                             puVar8[img_row_3._4_4_ + 4]);
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        else {
                                          puVar7[iVar4] = puVar8[iVar4];
                                          img_row_3._4_4_ = iVar4;
                                        }
                                        goto LAB_003c8690;
                                      }
                                      if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                        puVar7[iVar4] = 0;
                                        img_row_3._4_4_ = iVar4;
LAB_003c6680:
                                        do {
                                          iVar4 = img_row_3._4_4_ + 2;
                                          if ((int)(uStack_18 - 2) <= iVar4) {
                                            if ((int)(uStack_18 - 2) < iVar4) {
                                              if (puVar6[iVar4] == '\0') {
                                                if (puVar10[iVar4] == '\0') {
                                                  puVar7[iVar4] = 0;
                                                }
                                                else {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else if (puVar9[iVar4] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                }
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                              }
                                            }
                                            else if (puVar6[iVar4] == '\0') {
                                              if (puVar10[iVar4] == '\0') {
                                                if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                                    puVar7[iVar4] = 0;
                                                  }
                                                  else {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                }
                                                else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                              }
                                              else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                              }
                                            }
                                            else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                              if (puVar9[iVar4] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                }
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                              }
                                            }
                                            else if (puVar9[iVar4] == '\0') {
                                              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                puVar7[iVar4] = puVar8[iVar4];
                                              }
                                              else if (puVar9[iVar4 - lVar1] == '\0') {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar8[iVar4]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                              }
                                            }
                                            else {
                                              puVar7[iVar4] = puVar8[iVar4];
                                            }
                                            goto LAB_003d42bf;
                                          }
                                          if (puVar6[iVar4] != '\0') {
                                            if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                              if (puVar9[iVar4] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else if (puVar9[iVar4 - lVar1] == '\0') {
                                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                     puVar8[iVar4]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              goto LAB_003cca9c;
                                            }
                                            if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                              if (puVar9[iVar4] != '\0') {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003cb977;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003cadc0;
                                              }
                                              uVar5 = TTA::NewLabel();
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003cadc0;
                                            }
                                            if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                              if (puVar9[iVar4] != '\0') {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c7f21;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              goto LAB_003c7a5b;
                                            }
                                            if (puVar9[iVar4] == '\0') {
                                              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0'
                                                      ) {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar8[img_row_3._4_4_ + 4]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else if (puVar9[iVar4 - lVar1] == '\0') {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar8[iVar4]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                            }
                                            else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                            {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar8[img_row_3._4_4_ + 4]);
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else {
                                              puVar7[iVar4] = puVar8[iVar4];
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            goto LAB_003c8690;
                                          }
                                          if (puVar10[iVar4] == '\0') {
                                            if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c8b4b;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c7a5b;
                                                }
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c7f21;
                                              }
                                              if (puVar9[iVar4] == '\0') {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0'
                                                      ) {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar8[img_row_3._4_4_ + 4]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              goto LAB_003c8690;
                                            }
                                            if (puVar10[img_row_3._4_4_ + 3] != '\0') {
                                              uVar5 = TTA::NewLabel();
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003c6f3e;
                                            }
                                            puVar7[iVar4] = 0;
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003c6680;
                                          }
                                          if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                            if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                              puVar7[iVar4] = puVar8[iVar4];
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003c8b4b;
                                            }
                                            if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                              if (puVar9[iVar4] == '\0') {
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c7a5b;
                                              }
                                              puVar7[iVar4] = puVar8[iVar4];
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003c7f21;
                                            }
                                            if (puVar9[iVar4] == '\0') {
                                              puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                            {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar8[img_row_3._4_4_ + 4]);
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else {
                                              puVar7[iVar4] = puVar8[iVar4];
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            goto LAB_003c8690;
                                          }
                                          uVar5 = TTA::NewLabel();
                                          puVar7[iVar4] = uVar5;
                                          img_row_3._4_4_ = iVar4;
LAB_003c9309:
                                          iVar4 = img_row_3._4_4_ + 2;
                                          if ((int)(uStack_18 - 2) <= iVar4) {
                                            if ((int)(uStack_18 - 2) < iVar4) {
                                              if (puVar6[iVar4] == '\0') {
                                                if (puVar10[iVar4] == '\0') {
                                                  puVar7[iVar4] = 0;
                                                }
                                                else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                              }
                                              else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                            }
                                            else if (puVar6[iVar4] == '\0') {
                                              if (puVar10[iVar4] == '\0') {
                                                if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                                    puVar7[iVar4] = 0;
                                                  }
                                                  else {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                }
                                                else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                              }
                                              else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                            }
                                            else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else if (puVar9[iVar4] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                                else if (puVar9[iVar4 - lVar1] == '\0') {
                                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                     puVar8[iVar4]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                }
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                              }
                                            }
                                            else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                            }
                                            else if (puVar9[iVar4] == '\0') {
                                              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                              else if (puVar9[iVar4 - lVar1] == '\0') {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar8[iVar4]);
                                                uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                              else {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                            }
                                            else {
                                              uVar5 = TTA::Merge(puVar8[iVar4],
                                                                 puVar7[img_row_3._4_4_]);
                                              puVar7[iVar4] = uVar5;
                                            }
                                            goto LAB_003d42bf;
                                          }
                                          if (puVar6[iVar4] != '\0') {
                                            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[iVar4 - lVar1] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[iVar4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003cca9c;
                                              }
                                              if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar9[iVar4] != '\0') {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003c7f21;
                                                  }
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  goto LAB_003c7a5b;
                                                }
                                                if (puVar9[iVar4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                           '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[img_row_3._4_4_ + 4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[iVar4 - lVar1] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[iVar4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                }
                                                else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                         '\0') {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar8[img_row_3._4_4_ + 4]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003c8690;
                                              }
                                              if (puVar9[iVar4] != '\0') {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003cb977;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                            }
                                            else {
                                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[iVar4],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[iVar4 - lVar1] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[iVar4]);
                                                    uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]
                                                                      );
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003cca9c;
                                              }
                                              if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003ca4be;
                                                  }
                                                  if (puVar9[iVar4] == '\0') {
                                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003c7a5b;
                                                  }
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c7f21;
                                                }
                                                if (puVar9[iVar4] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                           '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[img_row_3._4_4_ + 4]);
                                                    uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]
                                                                      );
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[iVar4 - lVar1] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[iVar4]);
                                                    uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]
                                                                      );
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                }
                                                else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                         '\0') {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar8[img_row_3._4_4_ + 4]);
                                                  uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003c8690;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 1] != '\0') {
                                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003cde33;
                                              }
                                              if (puVar9[iVar4] != '\0') {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003cb977;
                                              }
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar4;
                                            }
LAB_003cadc0:
                                            iVar4 = img_row_3._4_4_ + 2;
                                            if ((int)(uStack_18 - 2) <= iVar4) {
                                              if ((int)(uStack_18 - 2) < iVar4) {
                                                if (puVar6[iVar4] == '\0') {
                                                  if (puVar10[iVar4] == '\0') {
                                                    puVar7[iVar4] = 0;
                                                  }
                                                  else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                  }
                                                }
                                                else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else if (puVar6[iVar4] == '\0') {
                                                if (puVar10[iVar4] == '\0') {
                                                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                                      puVar7[iVar4] = 0;
                                                    }
                                                    else {
                                                      uVar5 = TTA::NewLabel();
                                                      puVar7[iVar4] = uVar5;
                                                    }
                                                  }
                                                  else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar9[iVar4] == '\0') {
                                                      uVar5 = TTA::NewLabel();
                                                      puVar7[iVar4] = uVar5;
                                                    }
                                                    else {
                                                      puVar7[iVar4] = puVar8[iVar4];
                                                    }
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                  }
                                                }
                                                else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                    if (puVar9[iVar4] == '\0') {
                                                      uVar5 = TTA::NewLabel();
                                                      puVar7[iVar4] = uVar5;
                                                    }
                                                    else {
                                                      puVar7[iVar4] = puVar8[iVar4];
                                                    }
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                  }
                                                  else {
                                                    uVar5 = TTA::Merge(puVar8[iVar4],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                  }
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                }
                                              }
                                              else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                }
                                              }
                                              else {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                              }
                                              goto LAB_003d42bf;
                                            }
                                            if (puVar6[iVar4] != '\0') {
                                              if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003cca9c;
                                                }
                                                if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                    if (puVar9[iVar4] == '\0') {
                                                      uVar5 = TTA::NewLabel();
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                      goto LAB_003c7a5b;
                                                    }
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003c7f21;
                                                  }
                                                  if (puVar9[iVar4] == '\0') {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                           '\0') {
                                                    uVar5 = TTA::Merge(puVar8[iVar4],
                                                                       puVar8[img_row_3._4_4_ + 4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  goto LAB_003c8690;
                                                }
                                                if (puVar9[iVar4] != '\0') {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003cb977;
                                                }
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003cca9c;
                                                }
                                                if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                                  if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                    if (puVar9[iVar4] == '\0') {
                                                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar4;
                                                      goto LAB_003c7a5b;
                                                    }
                                                    uVar5 = TTA::Merge(puVar8[iVar4],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003c7f21;
                                                  }
                                                  if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                                  {
                                                    if (puVar9[iVar4] == '\0') {
                                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4]
                                                                         ,puVar7[img_row_3._4_4_]);
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    else {
                                                      uVar5 = TTA::Merge(puVar8[iVar4],
                                                                         puVar8[img_row_3._4_4_ + 4]
                                                                        );
                                                      uVar5 = TTA::Merge(uVar5,puVar7[img_row_3.
                                                                                      _4_4_]);
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                  }
                                                  else {
                                                    uVar5 = TTA::Merge(puVar8[iVar4],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  goto LAB_003c8690;
                                                }
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
LAB_003cb977:
                                                  while( true ) {
                                                    while( true ) {
                                                      iVar4 = img_row_3._4_4_ + 2;
                                                      if ((int)(uStack_18 - 2) <= iVar4) {
                                                        if ((int)(uStack_18 - 2) < iVar4) {
                                                          if (puVar6[iVar4] == '\0') {
                                                            if (puVar10[iVar4] == '\0') {
                                                              puVar7[iVar4] = 0;
                                                            }
                                                            else if (puVar10[img_row_3._4_4_ + 1] ==
                                                                     '\0') {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                            }
                                                            else {
                                                              puVar7[iVar4] =
                                                                   puVar7[img_row_3._4_4_];
                                                            }
                                                          }
                                                          else if (puVar10[img_row_3._4_4_ + 1] ==
                                                                   '\0') {
                                                            if (puVar9[iVar4] == '\0') {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                            }
                                                            else {
                                                              puVar7[iVar4] = puVar8[iVar4];
                                                            }
                                                          }
                                                          else if (puVar9[iVar4] == '\0') {
                                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                          }
                                                          else if (puVar9[(img_row_3._4_4_ + 1) -
                                                                          lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            puVar7[iVar4] = uVar5;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar6[iVar4] == '\0') {
                                                          if (puVar10[iVar4] == '\0') {
                                                            if (puVar6[img_row_3._4_4_ + 3] == '\0')
                                                            {
                                                              if (puVar10[img_row_3._4_4_ + 3] ==
                                                                  '\0') {
                                                                puVar7[iVar4] = 0;
                                                              }
                                                              else {
                                                                uVar5 = TTA::NewLabel();
                                                                puVar7[iVar4] = uVar5;
                                                              }
                                                            }
                                                            else if (puVar9[img_row_3._4_4_ + 3] ==
                                                                     '\0') {
                                                              if (puVar9[iVar4] == '\0') {
                                                                uVar5 = TTA::NewLabel();
                                                                puVar7[iVar4] = uVar5;
                                                              }
                                                              else {
                                                                puVar7[iVar4] = puVar8[iVar4];
                                                              }
                                                            }
                                                            else {
                                                              puVar7[iVar4] = puVar8[iVar4];
                                                            }
                                                          }
                                                          else if (puVar6[img_row_3._4_4_ + 3] ==
                                                                   '\0') {
                                                            if (puVar10[img_row_3._4_4_ + 1] == '\0'
                                                               ) {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                            }
                                                            else {
                                                              puVar7[iVar4] =
                                                                   puVar7[img_row_3._4_4_];
                                                            }
                                                          }
                                                          else if (puVar10[img_row_3._4_4_ + 1] ==
                                                                   '\0') {
                                                            if (puVar9[img_row_3._4_4_ + 3] == '\0')
                                                            {
                                                              if (puVar9[iVar4] == '\0') {
                                                                uVar5 = TTA::NewLabel();
                                                                puVar7[iVar4] = uVar5;
                                                              }
                                                              else {
                                                                puVar7[iVar4] = puVar8[iVar4];
                                                              }
                                                            }
                                                            else {
                                                              puVar7[iVar4] = puVar8[iVar4];
                                                            }
                                                          }
                                                          else if (puVar9[img_row_3._4_4_ + 3] ==
                                                                   '\0') {
                                                            if (puVar9[iVar4] == '\0') {
                                                              puVar7[iVar4] =
                                                                   puVar7[img_row_3._4_4_];
                                                            }
                                                            else if (puVar9[(img_row_3._4_4_ + 1) -
                                                                            lVar1] == '\0') {
                                                              uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                        _4_4_],
                                                                                 puVar8[iVar4]);
                                                              puVar7[iVar4] = uVar5;
                                                            }
                                                            else {
                                                              puVar7[iVar4] =
                                                                   puVar8[img_row_3._4_4_];
                                                            }
                                                          }
                                                          else if (puVar9[(img_row_3._4_4_ + 1) -
                                                                          lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            puVar7[iVar4] = uVar5;
                                                          }
                                                          else if (puVar9[iVar4] == '\0') {
                                                            if (puVar9[iVar4 - lVar1] == '\0') {
                                                              uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                        _4_4_],
                                                                                 puVar8[iVar4]);
                                                              puVar7[iVar4] = uVar5;
                                                            }
                                                            else {
                                                              puVar7[iVar4] =
                                                                   puVar8[img_row_3._4_4_];
                                                            }
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar10[img_row_3._4_4_ + 1] ==
                                                                 '\0') {
                                                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                                            if (puVar9[iVar4] == '\0') {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                            }
                                                            else {
                                                              puVar7[iVar4] = puVar8[iVar4];
                                                            }
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                          }
                                                        }
                                                        else if (puVar9[img_row_3._4_4_ + 3] == '\0'
                                                                ) {
                                                          if (puVar9[iVar4] == '\0') {
                                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                          }
                                                          else if (puVar9[(img_row_3._4_4_ + 1) -
                                                                          lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            puVar7[iVar4] = uVar5;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else if (puVar9[(img_row_3._4_4_ + 1) -
                                                                        lVar1] == '\0') {
                                                          uVar5 = TTA::Merge(puVar8[img_row_3._4_4_]
                                                                             ,puVar8[iVar4]);
                                                          puVar7[iVar4] = uVar5;
                                                        }
                                                        else if (puVar9[iVar4] == '\0') {
                                                          if (puVar9[iVar4 - lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            puVar7[iVar4] = uVar5;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                          }
                                                        }
                                                        else {
                                                          puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                        }
                                                        goto LAB_003d42bf;
                                                      }
                                                      if (puVar6[iVar4] == '\0') {
                                                        if (puVar10[iVar4] == '\0') {
                                                          if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                            if (puVar10[img_row_3._4_4_ + 3] != '\0'
                                                               ) {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                              img_row_3._4_4_ = iVar4;
                                                              goto LAB_003c6f3e;
                                                            }
                                                            puVar7[iVar4] = 0;
                                                            img_row_3._4_4_ = iVar4;
                                                            goto LAB_003c6680;
                                                          }
                                                          if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                            img_row_3._4_4_ = iVar4;
                                                            goto LAB_003c8b4b;
                                                          }
                                                          if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                            if (puVar9[iVar4] == '\0') {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                              img_row_3._4_4_ = iVar4;
                                                              goto LAB_003c7a5b;
                                                            }
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                            img_row_3._4_4_ = iVar4;
                                                            goto LAB_003c7f21;
                                                          }
                                                          if (puVar9[iVar4] == '\0') {
                                                            puVar7[iVar4] =
                                                                 puVar8[img_row_3._4_4_ + 4];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else if (puVar9[(img_row_3._4_4_ + 3) -
                                                                          lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[iVar4],
                                                                               puVar8[img_row_3.
                                                                                      _4_4_ + 4]);
                                                            puVar7[iVar4] = uVar5;
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          goto LAB_003c8690;
                                                        }
                                                        if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                          if (puVar10[img_row_3._4_4_ + 1] == '\0')
                                                          {
                                                            uVar5 = TTA::NewLabel();
                                                            puVar7[iVar4] = uVar5;
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          goto LAB_003c9309;
                                                        }
                                                        if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                          if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                            img_row_3._4_4_ = iVar4;
                                                            goto LAB_003c8b4b;
                                                          }
                                                          if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                            if (puVar9[iVar4] == '\0') {
                                                              uVar5 = TTA::NewLabel();
                                                              puVar7[iVar4] = uVar5;
                                                              img_row_3._4_4_ = iVar4;
                                                              goto LAB_003c7a5b;
                                                            }
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                            img_row_3._4_4_ = iVar4;
                                                            goto LAB_003c7f21;
                                                          }
                                                          if (puVar9[iVar4] == '\0') {
                                                            puVar7[iVar4] =
                                                                 puVar8[img_row_3._4_4_ + 4];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else if (puVar9[(img_row_3._4_4_ + 3) -
                                                                          lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[iVar4],
                                                                               puVar8[img_row_3.
                                                                                      _4_4_ + 4]);
                                                            puVar7[iVar4] = uVar5;
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[iVar4];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          goto LAB_003c8690;
                                                        }
                                                        if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                          if (puVar9[(img_row_3._4_4_ + 1) - lVar1]
                                                              == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            puVar7[iVar4] = uVar5;
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else if (puVar9[iVar4] == '\0') {
                                                            if (puVar9[iVar4 - lVar1] == '\0') {
                                                              uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                        _4_4_],
                                                                                 puVar8[iVar4]);
                                                              puVar7[iVar4] = uVar5;
                                                              img_row_3._4_4_ = iVar4;
                                                            }
                                                            else {
                                                              puVar7[iVar4] =
                                                                   puVar8[img_row_3._4_4_];
                                                              img_row_3._4_4_ = iVar4;
                                                            }
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          goto LAB_003c8b4b;
                                                        }
                                                        if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                          if (puVar9[iVar4] == '\0') {
                                                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                            img_row_3._4_4_ = iVar4;
                                                            goto LAB_003c7a5b;
                                                          }
                                                          if (puVar9[(img_row_3._4_4_ + 1) - lVar1]
                                                              == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            puVar7[iVar4] = uVar5;
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else {
                                                            puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          goto LAB_003c7f21;
                                                        }
                                                        if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                            '\0') {
                                                          if (puVar9[iVar4] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_ + 4],
                                                                               puVar7[img_row_3.
                                                                                      _4_4_]);
                                                            puVar7[iVar4] = uVar5;
                                                            img_row_3._4_4_ = iVar4;
                                                          }
                                                          else if (puVar9[(img_row_3._4_4_ + 1) -
                                                                          lVar1] == '\0') {
                                                            uVar5 = TTA::Merge(puVar8[img_row_3.
                                                                                      _4_4_],
                                                                               puVar8[iVar4]);
                                                            uVar5 = TTA::Merge(uVar5,puVar8[
                                                  img_row_3._4_4_ + 4]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[img_row_3._4_4_ + 4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  }
                                                  else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] ==
                                                           '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[iVar4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else if (puVar9[iVar4] == '\0') {
                                                    if (puVar9[iVar4 - lVar1] == '\0') {
                                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                         puVar8[iVar4]);
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    else {
                                                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  goto LAB_003c8690;
                                                  }
                                                  if (puVar10[img_row_3._4_4_ + 1] == '\0') break;
                                                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                    if (puVar9[(img_row_3._4_4_ + 1) - lVar1] ==
                                                        '\0') {
                                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                         puVar8[iVar4]);
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    else if (puVar9[iVar4] == '\0') {
                                                      if (puVar9[iVar4 - lVar1] == '\0') {
                                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                           puVar8[iVar4]);
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                      else {
                                                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                    }
                                                    else {
                                                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    goto LAB_003cca9c;
                                                  }
                                                  if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                                    if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                      if (puVar9[iVar4] == '\0') {
                                                        puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                        img_row_3._4_4_ = iVar4;
                                                        goto LAB_003c7a5b;
                                                      }
                                                      if (puVar9[(img_row_3._4_4_ + 1) - lVar1] ==
                                                          '\0') {
                                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                           puVar8[iVar4]);
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                      else {
                                                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                      goto LAB_003c7f21;
                                                    }
                                                    if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                        '\0') {
                                                      if (puVar9[iVar4] == '\0') {
                                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ +
                                                                                  4],
                                                                           puVar7[img_row_3._4_4_]);
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                      else if (puVar9[(img_row_3._4_4_ + 1) - lVar1]
                                                               == '\0') {
                                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                           puVar8[iVar4]);
                                                        uVar5 = TTA::Merge(uVar5,puVar8[img_row_3.
                                                                                        _4_4_ + 4]);
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                      else {
                                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                           puVar8[img_row_3._4_4_ +
                                                                                  4]);
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                    }
                                                    else if (puVar9[(img_row_3._4_4_ + 1) - lVar1]
                                                             == '\0') {
                                                      uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                         puVar8[iVar4]);
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    else if (puVar9[iVar4] == '\0') {
                                                      if (puVar9[iVar4 - lVar1] == '\0') {
                                                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                           puVar8[iVar4]);
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                      else {
                                                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                        img_row_3._4_4_ = iVar4;
                                                      }
                                                    }
                                                    else {
                                                      puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    goto LAB_003c8690;
                                                  }
                                                  if (puVar9[iVar4] == '\0') {
                                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003cadc0;
                                                  }
                                                  if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0')
                                                  {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],
                                                                       puVar8[iVar4]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  }
                                                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                    puVar7[iVar4] = puVar8[iVar4];
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003cca9c;
                                                  }
                                                  if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                                    if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                      if (puVar9[iVar4] == '\0') {
                                                        uVar5 = TTA::NewLabel();
                                                        puVar7[iVar4] = uVar5;
                                                        img_row_3._4_4_ = iVar4;
                                                        goto LAB_003c7a5b;
                                                      }
                                                      puVar7[iVar4] = puVar8[iVar4];
                                                      img_row_3._4_4_ = iVar4;
                                                      goto LAB_003c7f21;
                                                    }
                                                    if (puVar9[iVar4] == '\0') {
                                                      puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    else if (puVar9[(img_row_3._4_4_ + 3) - lVar1]
                                                             == '\0') {
                                                      uVar5 = TTA::Merge(puVar8[iVar4],
                                                                         puVar8[img_row_3._4_4_ + 4]
                                                                        );
                                                      puVar7[iVar4] = uVar5;
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    else {
                                                      puVar7[iVar4] = puVar8[iVar4];
                                                      img_row_3._4_4_ = iVar4;
                                                    }
                                                    goto LAB_003c8690;
                                                  }
                                                  if (puVar9[iVar4] == '\0') break;
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  }
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                              }
                                              goto LAB_003cadc0;
                                            }
                                            if (puVar10[iVar4] == '\0') {
                                              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                                if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                                  puVar7[iVar4] = 0;
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c6680;
                                                }
                                                uVar5 = TTA::NewLabel();
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c6f3e;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c8b4b;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  uVar5 = TTA::NewLabel();
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c7a5b;
                                                }
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c7f21;
                                              }
                                              if (puVar9[iVar4] == '\0') {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0'
                                                      ) {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar8[img_row_3._4_4_ + 4]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              goto LAB_003c8690;
                                            }
                                            if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                              if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c8b4b;
                                                }
                                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003c7a5b;
                                                  }
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c7f21;
                                                }
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                         '\0') {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar8[img_row_3._4_4_ + 4]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003c8690;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c8b4b;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c7a5b;
                                                }
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c7f21;
                                              }
                                              if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                                if (puVar9[iVar4] == '\0') {
                                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar8[img_row_3._4_4_ + 4]);
                                                  uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                              }
                                              else {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              goto LAB_003c8690;
                                            }
                                            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                              uVar5 = TTA::NewLabel();
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else {
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            goto LAB_003c9309;
                                          }
                                          if (puVar10[iVar4] != '\0') {
                                            if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                              if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                                if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c8b4b;
                                                }
                                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::NewLabel();
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                    goto LAB_003c7a5b;
                                                  }
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                  goto LAB_003c7f21;
                                                }
                                                if (puVar9[iVar4] == '\0') {
                                                  puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] ==
                                                         '\0') {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar8[img_row_3._4_4_ + 4]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                else {
                                                  puVar7[iVar4] = puVar8[iVar4];
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003c8690;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c8b4b;
                                              }
                                              if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                                if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                                  if (puVar9[iVar4] == '\0') {
                                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                                       puVar7[img_row_3._4_4_]);
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                  else {
                                                    uVar5 = TTA::Merge(puVar8[iVar4],
                                                                       puVar8[img_row_3._4_4_ + 4]);
                                                    uVar5 = TTA::Merge(uVar5,puVar7[img_row_3._4_4_]
                                                                      );
                                                    puVar7[iVar4] = uVar5;
                                                    img_row_3._4_4_ = iVar4;
                                                  }
                                                }
                                                else {
                                                  uVar5 = TTA::Merge(puVar8[iVar4],
                                                                     puVar7[img_row_3._4_4_]);
                                                  puVar7[iVar4] = uVar5;
                                                  img_row_3._4_4_ = iVar4;
                                                }
                                                goto LAB_003c8690;
                                              }
                                              if (puVar9[iVar4] != '\0') {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar7[img_row_3._4_4_]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                                goto LAB_003c7f21;
                                              }
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003c7a5b;
                                            }
                                            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                              uVar5 = TTA::NewLabel();
                                              puVar7[iVar4] = uVar5;
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            else {
                                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                              img_row_3._4_4_ = iVar4;
                                            }
                                            goto LAB_003c9309;
                                          }
                                          if (puVar6[img_row_3._4_4_ + 3] != '\0') {
                                            if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                              puVar7[iVar4] = puVar8[iVar4];
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003c8b4b;
                                            }
                                            if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                              if (puVar9[iVar4] == '\0') {
                                                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0'
                                                      ) {
                                                uVar5 = TTA::Merge(puVar8[iVar4],
                                                                   puVar8[img_row_3._4_4_ + 4]);
                                                puVar7[iVar4] = uVar5;
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              else {
                                                puVar7[iVar4] = puVar8[iVar4];
                                                img_row_3._4_4_ = iVar4;
                                              }
                                              goto LAB_003c8690;
                                            }
                                            if (puVar9[iVar4] != '\0') {
                                              puVar7[iVar4] = puVar8[iVar4];
                                              img_row_3._4_4_ = iVar4;
                                              goto LAB_003c7f21;
                                            }
                                            uVar5 = TTA::NewLabel();
                                            puVar7[iVar4] = uVar5;
                                            img_row_3._4_4_ = iVar4;
                                            goto LAB_003c7a5b;
                                          }
                                          if (puVar10[img_row_3._4_4_ + 3] != '\0')
                                          goto code_r0x003ca487;
                                          puVar7[iVar4] = 0;
                                          img_row_3._4_4_ = iVar4;
                                        } while( true );
                                      }
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                      img_row_3._4_4_ = iVar4;
                                    } while( true );
                                  }
                                  if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                                    puVar7[iVar4] = puVar8[iVar4];
                                    img_row_3._4_4_ = iVar4;
                                    goto LAB_003c8b4b;
                                  }
                                  if (puVar9[img_row_3._4_4_ + 4] != '\0') {
                                    puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                    img_row_3._4_4_ = iVar4;
                                    goto LAB_003c8690;
                                  }
                                  uVar5 = TTA::NewLabel();
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                } while( true );
                              }
                              if ((int)(uStack_18 - 2) < iVar4) {
                                if (puVar6[iVar4] == '\0') {
                                  if (puVar10[iVar4] == '\0') {
                                    puVar7[iVar4] = 0;
                                  }
                                  else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                  }
                                }
                                else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                  if (puVar9[iVar4] == '\0') {
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[iVar4];
                                  }
                                }
                                else if (puVar9[iVar4] == '\0') {
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                }
                                else if (puVar9[img_row_3._4_4_] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                }
                              }
                              else if (puVar6[iVar4] == '\0') {
                                if (puVar10[iVar4] == '\0') {
                                  if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                      puVar7[iVar4] = 0;
                                    }
                                    else {
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                    }
                                  }
                                  else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar9[iVar4] == '\0') {
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                    }
                                    else {
                                      puVar7[iVar4] = puVar8[iVar4];
                                    }
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[iVar4];
                                  }
                                }
                                else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                  if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                  }
                                }
                                else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                  if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                    if (puVar9[iVar4] == '\0') {
                                      uVar5 = TTA::NewLabel();
                                      puVar7[iVar4] = uVar5;
                                    }
                                    else {
                                      puVar7[iVar4] = puVar8[iVar4];
                                    }
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[iVar4];
                                  }
                                }
                                else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                  if (puVar9[iVar4] == '\0') {
                                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                  }
                                  else if (puVar9[img_row_3._4_4_] == '\0') {
                                    uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                  }
                                }
                                else if (puVar9[img_row_3._4_4_] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else if (puVar9[iVar4] == '\0') {
                                  if (puVar9[iVar4 - lVar1] == '\0') {
                                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                  }
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                }
                              }
                              else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
                                if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                  if (puVar9[iVar4] == '\0') {
                                    uVar5 = TTA::NewLabel();
                                    puVar7[iVar4] = uVar5;
                                  }
                                  else {
                                    puVar7[iVar4] = puVar8[iVar4];
                                  }
                                }
                                else {
                                  puVar7[iVar4] = puVar8[iVar4];
                                }
                              }
                              else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar9[iVar4] == '\0') {
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                }
                                else if (puVar9[img_row_3._4_4_] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                }
                              }
                              else if (puVar9[img_row_3._4_4_] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                puVar7[iVar4] = uVar5;
                              }
                              else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                puVar7[iVar4] = uVar5;
                              }
                              else if (puVar9[iVar4] == '\0') {
                                if (puVar9[iVar4 - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                }
                              }
                              else {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                              }
                              goto LAB_003d42bf;
                            }
                            if (puVar10[iVar4] == '\0') {
                              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                                  puVar7[iVar4] = 0;
                                  img_row_3._4_4_ = iVar4;
                                  goto LAB_003c6680;
                                }
                                uVar5 = TTA::NewLabel();
                                puVar7[iVar4] = uVar5;
                                img_row_3._4_4_ = iVar4;
                                goto LAB_003c6f3e;
                              }
                              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                  uVar5 = TTA::NewLabel();
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                  goto LAB_003c7a5b;
                                }
                                puVar7[iVar4] = puVar8[img_row_3._4_4_ + 4];
                                img_row_3._4_4_ = iVar4;
                                goto LAB_003c8690;
                              }
                              puVar7[iVar4] = puVar8[iVar4];
                              img_row_3._4_4_ = iVar4;
                            }
                            else {
                              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                                puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar4;
                                goto LAB_003c9309;
                              }
                              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                                  puVar7[iVar4] = puVar7[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar4;
                                  goto LAB_003ca4be;
                                }
                                if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],
                                                     puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else if (puVar9[iVar4 - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_3._4_4_ = iVar4;
                                }
                                else {
                                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                  img_row_3._4_4_ = iVar4;
                                }
                                goto LAB_003c8690;
                              }
                              if (puVar9[iVar4 - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                puVar7[iVar4] = uVar5;
                                img_row_3._4_4_ = iVar4;
                              }
                              else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                                puVar7[iVar4] = uVar5;
                                img_row_3._4_4_ = iVar4;
                              }
                              else {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar4;
                              }
                            }
                          }
                          else {
                            puVar7[iVar4] = puVar8[iVar4];
                            img_row_3._4_4_ = iVar4;
                          }
                        }
                        else {
                          if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                            puVar7[iVar4] = puVar7[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar4;
                            goto LAB_003c9309;
                          }
                          if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                            if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                              puVar7[iVar4] = puVar7[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar4;
                              goto LAB_003ca4be;
                            }
                            if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]
                                                );
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else if (puVar9[iVar4] == '\0') {
                              if (puVar9[iVar4 - lVar1] == '\0') {
                                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                                puVar7[iVar4] = uVar5;
                                img_row_3._4_4_ = iVar4;
                              }
                              else {
                                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                                img_row_3._4_4_ = iVar4;
                              }
                            }
                            else {
                              puVar7[iVar4] = puVar8[iVar4];
                              img_row_3._4_4_ = iVar4;
                            }
                            goto LAB_003c8690;
                          }
                          if (puVar9[iVar4] == '\0') {
                            if (puVar9[iVar4 - lVar1] == '\0') {
                              uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                              puVar7[iVar4] = uVar5;
                              img_row_3._4_4_ = iVar4;
                            }
                            else {
                              puVar7[iVar4] = puVar8[img_row_3._4_4_];
                              img_row_3._4_4_ = iVar4;
                            }
                          }
                          else {
                            puVar7[iVar4] = puVar8[iVar4];
                            img_row_3._4_4_ = iVar4;
                          }
                        }
                      } while( true );
                    }
                    if (puVar9[img_row_3._4_4_ + 3] != '\0') {
                      if (puVar9[iVar4 - lVar1] == '\0') {
                        uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                        puVar7[iVar4] = uVar5;
                        img_row_3._4_4_ = iVar4;
                      }
                      else if (puVar9[img_row_3._4_4_] == '\0') {
                        uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                        puVar7[iVar4] = uVar5;
                        img_row_3._4_4_ = iVar4;
                      }
                      else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                        uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                        puVar7[iVar4] = uVar5;
                        img_row_3._4_4_ = iVar4;
                      }
                      else {
                        puVar7[iVar4] = puVar8[img_row_3._4_4_];
                        img_row_3._4_4_ = iVar4;
                      }
                      goto LAB_003cca9c;
                    }
                    if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                      puVar7[iVar4] = puVar7[img_row_3._4_4_];
                      img_row_3._4_4_ = iVar4;
                      goto LAB_003cde33;
                    }
                    if (puVar9[img_row_3._4_4_ + 4] != '\0') goto code_r0x003ca6bb;
                    puVar7[iVar4] = puVar7[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                  } while( true );
                }
                if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else {
                  puVar7[iVar4] = puVar8[iVar4];
                  img_row_3._4_4_ = iVar4;
                }
              }
            } while( true );
          }
          if (puVar6[img_row_3._4_4_ + 1] == '\0') {
            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                  if (puVar9[iVar4] == '\0') {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003cadc0;
                  }
                  puVar7[iVar4] = puVar8[iVar4];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003cb977;
                }
                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                  if (puVar9[iVar4] == '\0') {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                    goto LAB_003c7a5b;
                  }
                  puVar7[iVar4] = puVar8[iVar4];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003c7f21;
                }
                if (puVar9[iVar4] == '\0') {
                  if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[img_row_3._4_4_ + 4]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else if (puVar9[iVar4 - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                  }
                }
                else if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[iVar4],puVar8[img_row_3._4_4_ + 4]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else {
                  puVar7[iVar4] = puVar8[iVar4];
                  img_row_3._4_4_ = iVar4;
                }
                goto LAB_003c8690;
              }
              if (puVar9[iVar4] == '\0') {
                if (puVar9[iVar4 - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else {
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                }
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
                img_row_3._4_4_ = iVar4;
              }
            }
            else {
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003cde33;
                }
                if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                  goto LAB_003ca4be;
                }
                if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[img_row_3._4_4_ + 4]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else if (puVar9[iVar4] == '\0') {
                  if (puVar9[iVar4 - lVar1] == '\0') {
                    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                    puVar7[iVar4] = uVar5;
                    img_row_3._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar4;
                  }
                }
                else {
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                }
                goto LAB_003c8690;
              }
              if (puVar9[iVar4] == '\0') {
                if (puVar9[iVar4 - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else {
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                }
              }
              else {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar4;
              }
            }
          }
          else {
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar6[img_row_3._4_4_ + 3] == '\0') {
                puVar7[iVar4] = puVar7[img_row_3._4_4_];
                img_row_3._4_4_ = iVar4;
                goto LAB_003cde33;
              }
              if (puVar9[img_row_3._4_4_ + 4] == '\0') {
                puVar7[iVar4] = puVar7[img_row_3._4_4_];
                img_row_3._4_4_ = iVar4;
                goto LAB_003ca4be;
              }
              if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
                puVar7[iVar4] = uVar5;
                img_row_3._4_4_ = iVar4;
              }
              else if (puVar9[iVar4] == '\0') {
                if (puVar9[iVar4 - lVar1] == '\0') {
                  uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                  puVar7[iVar4] = uVar5;
                  img_row_3._4_4_ = iVar4;
                }
                else {
                  puVar7[iVar4] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar4;
                }
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
                img_row_3._4_4_ = iVar4;
              }
              goto LAB_003c8690;
            }
            if (puVar9[iVar4] == '\0') {
              if (puVar9[iVar4 - lVar1] == '\0') {
                uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
                puVar7[iVar4] = uVar5;
                img_row_3._4_4_ = iVar4;
              }
              else {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar4;
              }
            }
            else {
              puVar7[iVar4] = puVar8[iVar4];
              img_row_3._4_4_ = iVar4;
            }
          }
          goto LAB_003cca9c;
        }
        if ((int)(uStack_18 - 2) < iVar4) {
          if (puVar6[iVar4] == '\0') {
            if (puVar10[iVar4] == '\0') {
              puVar7[iVar4] = 0;
            }
            else if (puVar10[img_row_3._4_4_ + 1] == '\0') {
              if (puVar6[img_row_3._4_4_ + 1] == '\0') {
                uVar5 = TTA::NewLabel();
                puVar7[iVar4] = uVar5;
              }
              else {
                puVar7[iVar4] = puVar7[img_row_3._4_4_];
              }
            }
            else {
              puVar7[iVar4] = puVar7[img_row_3._4_4_];
            }
          }
          else if (puVar6[img_row_3._4_4_ + 1] == '\0') {
            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
              if (puVar9[iVar4] == '\0') {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
              }
            }
            else {
              puVar7[iVar4] = puVar8[img_row_3._4_4_];
            }
          }
          else {
            puVar7[iVar4] = puVar7[img_row_3._4_4_];
          }
        }
        else if (puVar6[iVar4] == '\0') {
          if (puVar10[iVar4] == '\0') {
            if (puVar6[img_row_3._4_4_ + 3] == '\0') {
              if (puVar10[img_row_3._4_4_ + 3] == '\0') {
                puVar7[iVar4] = 0;
              }
              else {
                uVar5 = TTA::NewLabel();
                puVar7[iVar4] = uVar5;
              }
            }
            else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[iVar4] == '\0') {
                uVar5 = TTA::NewLabel();
                puVar7[iVar4] = uVar5;
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
              }
            }
            else {
              puVar7[iVar4] = puVar8[iVar4];
            }
          }
          else if (puVar6[img_row_3._4_4_ + 3] == '\0') {
            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
              if (puVar6[img_row_3._4_4_ + 1] == '\0') {
                uVar5 = TTA::NewLabel();
                puVar7[iVar4] = uVar5;
              }
              else {
                puVar7[iVar4] = puVar7[img_row_3._4_4_];
              }
            }
            else {
              puVar7[iVar4] = puVar7[img_row_3._4_4_];
            }
          }
          else if (puVar6[img_row_3._4_4_ + 1] == '\0') {
            if (puVar10[img_row_3._4_4_ + 1] == '\0') {
              if (puVar9[img_row_3._4_4_ + 3] == '\0') {
                if (puVar9[iVar4] == '\0') {
                  uVar5 = TTA::NewLabel();
                  puVar7[iVar4] = uVar5;
                }
                else {
                  puVar7[iVar4] = puVar8[iVar4];
                }
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
              }
            }
            else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[iVar4] == '\0') {
                puVar7[iVar4] = puVar7[img_row_3._4_4_];
              }
              else {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
              }
            }
            else if (puVar9[iVar4] == '\0') {
              if (puVar9[iVar4 - lVar1] == '\0') {
                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                puVar7[iVar4] = uVar5;
              }
              else {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
              }
            }
            else {
              puVar7[iVar4] = puVar8[img_row_3._4_4_];
            }
          }
          else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
            puVar7[iVar4] = puVar7[img_row_3._4_4_];
          }
          else if (puVar9[iVar4] == '\0') {
            if (puVar9[iVar4 - lVar1] == '\0') {
              uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
              puVar7[iVar4] = uVar5;
            }
            else {
              puVar7[iVar4] = puVar8[img_row_3._4_4_];
            }
          }
          else {
            puVar7[iVar4] = puVar8[iVar4];
          }
        }
        else if (puVar6[img_row_3._4_4_ + 1] == '\0') {
          if (puVar10[img_row_3._4_4_ + 1] == '\0') {
            if (puVar9[img_row_3._4_4_ + 3] == '\0') {
              if (puVar9[iVar4] == '\0') {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
              }
              else {
                puVar7[iVar4] = puVar8[iVar4];
              }
            }
            else if (puVar9[iVar4] == '\0') {
              if (puVar9[iVar4 - lVar1] == '\0') {
                uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
                puVar7[iVar4] = uVar5;
              }
              else {
                puVar7[iVar4] = puVar8[img_row_3._4_4_];
              }
            }
            else {
              puVar7[iVar4] = puVar8[iVar4];
            }
          }
          else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
            puVar7[iVar4] = puVar8[img_row_3._4_4_];
          }
          else if (puVar9[iVar4] == '\0') {
            if (puVar9[iVar4 - lVar1] == '\0') {
              uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
              puVar7[iVar4] = uVar5;
            }
            else {
              puVar7[iVar4] = puVar8[img_row_3._4_4_];
            }
          }
          else {
            puVar7[iVar4] = puVar8[img_row_3._4_4_];
          }
        }
        else if (puVar9[img_row_3._4_4_ + 3] == '\0') {
          puVar7[iVar4] = puVar7[img_row_3._4_4_];
        }
        else if (puVar9[iVar4] == '\0') {
          if (puVar9[iVar4 - lVar1] == '\0') {
            uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
            puVar7[iVar4] = uVar5;
          }
          else {
            puVar7[iVar4] = puVar8[img_row_3._4_4_];
          }
        }
        else {
          puVar7[iVar4] = puVar8[iVar4];
        }
      }
LAB_003d42bf:
    }
    if ((o_cols & 1U) != 0) {
      iVar4 = e_rows + -1;
      puVar6 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          iVar4);
      lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar2 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar1;
      puVar7 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,iVar4);
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      img_row_4._4_4_ = -2;
LAB_003d43a1:
      iVar4 = img_row_4._4_4_ + 2;
      if (iVar4 < (int)(uStack_18 - 2)) {
        if (puVar6[iVar4] == '\0') {
          if (puVar6[img_row_4._4_4_ + 3] == '\0') {
            puVar7[iVar4] = 0;
            img_row_4._4_4_ = iVar4;
            goto LAB_003d47b7;
          }
          if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
            goto LAB_003d584d;
          }
          if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
            if (puVar6[iVar4 - lVar1] == '\0') {
              uVar5 = TTA::NewLabel();
              puVar7[iVar4] = uVar5;
              img_row_4._4_4_ = iVar4;
              goto LAB_003d4e58;
            }
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
            goto LAB_003d5129;
          }
          if (puVar6[iVar4 - lVar1] == '\0') {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
          }
          else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                               *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
            puVar7[iVar4] = uVar5;
            img_row_4._4_4_ = iVar4;
          }
          else {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
          }
        }
        else {
          if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
            goto LAB_003d5d0c;
          }
          if (puVar6[img_row_4._4_4_ + 3] == '\0') {
            if (puVar6[iVar4 - lVar1] == '\0') {
              uVar5 = TTA::NewLabel();
              puVar7[iVar4] = uVar5;
              img_row_4._4_4_ = iVar4;
            }
            else {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              img_row_4._4_4_ = iVar4;
            }
            goto LAB_003d43a1;
          }
          if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
            if (puVar6[iVar4 - lVar1] == '\0') {
              uVar5 = TTA::NewLabel();
              puVar7[iVar4] = uVar5;
              img_row_4._4_4_ = iVar4;
              goto LAB_003d4e58;
            }
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
            goto LAB_003d5129;
          }
          if (puVar6[iVar4 - lVar1] == '\0') {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
          }
          else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                               *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
            puVar7[iVar4] = uVar5;
            img_row_4._4_4_ = iVar4;
          }
          else {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            img_row_4._4_4_ = iVar4;
          }
        }
LAB_003d554d:
        do {
          iVar4 = img_row_4._4_4_ + 2;
          if ((int)(uStack_18 - 2) <= iVar4) {
            if ((int)(uStack_18 - 2) < iVar4) {
LAB_003d6bbc:
              img_row_4._4_4_ = iVar4;
              if (puVar6[img_row_4._4_4_] == '\0') {
                puVar7[img_row_4._4_4_] = 0;
              }
              else {
                puVar7[img_row_4._4_4_] = puVar7[img_row_4._4_4_ + -2];
              }
            }
            else if (puVar6[iVar4] == '\0') {
              if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                puVar7[iVar4] = 0;
              }
              else {
                puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              }
            }
            else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
              puVar7[iVar4] = puVar7[img_row_4._4_4_];
            }
            else {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
            }
            goto LAB_003d7cc1;
          }
          if (puVar6[iVar4] == '\0') {
            if (puVar6[img_row_4._4_4_ + 3] == '\0') {
              puVar7[iVar4] = 0;
              img_row_4._4_4_ = iVar4;
              goto LAB_003d47b7;
            }
            if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              img_row_4._4_4_ = iVar4;
              goto LAB_003d584d;
            }
            if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              img_row_4._4_4_ = iVar4;
              goto LAB_003d5129;
            }
            if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
              uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                 *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
              puVar7[iVar4] = uVar5;
              img_row_4._4_4_ = iVar4;
            }
            else {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              img_row_4._4_4_ = iVar4;
            }
          }
          else {
            if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              img_row_4._4_4_ = iVar4;
              goto LAB_003d5d0c;
            }
            if (puVar6[img_row_4._4_4_ + 3] == '\0') {
              puVar7[iVar4] = puVar7[img_row_4._4_4_];
              img_row_4._4_4_ = iVar4;
              goto LAB_003d43a1;
            }
            if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
              puVar7[iVar4] = puVar7[img_row_4._4_4_];
              img_row_4._4_4_ = iVar4;
LAB_003d6576:
              do {
                iVar4 = img_row_4._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar4) {
                  if ((int)(uStack_18 - 2) < iVar4) goto LAB_003d6bbc;
                  if (puVar6[iVar4] == '\0') {
                    if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                      puVar7[iVar4] = 0;
                    }
                    else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                      uVar5 = TTA::NewLabel();
                      puVar7[iVar4] = uVar5;
                    }
                    else {
                      puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                    }
                  }
                  else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                    puVar7[iVar4] = puVar7[img_row_4._4_4_];
                  }
                  else if (puVar6[iVar4 + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                  }
                  else if (puVar6[img_row_4._4_4_ - lVar1] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                  }
                  else if (puVar6[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3),
                                       *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                    puVar7[iVar4] = uVar5;
                  }
                  else {
                    puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                  }
                  goto LAB_003d7cc1;
                }
                if (puVar6[iVar4] == '\0') {
                  if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                    puVar7[iVar4] = 0;
                    img_row_4._4_4_ = iVar4;
                    goto LAB_003d47b7;
                  }
                  if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                    puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                    img_row_4._4_4_ = iVar4;
                    goto LAB_003d584d;
                  }
                  if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                    uVar5 = TTA::NewLabel();
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                    goto LAB_003d4e58;
                  }
                  puVar7[iVar4] = *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                  img_row_4._4_4_ = iVar4;
                  goto LAB_003d554d;
                }
                if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                  if (puVar6[iVar4 + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else if (puVar6[img_row_4._4_4_ - lVar1] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else if (puVar6[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3),
                                       *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                    img_row_4._4_4_ = iVar4;
                  }
LAB_003d5d0c:
                  iVar4 = img_row_4._4_4_ + 2;
                  if ((int)(uStack_18 - 2) <= iVar4) {
                    if ((int)(uStack_18 - 2) < iVar4) {
                      if (puVar6[iVar4] == '\0') {
                        puVar7[iVar4] = 0;
                      }
                      else if (puVar6[img_row_4._4_4_ + 1] == '\0') {
                        if (puVar6[iVar4 - lVar1] == '\0') {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                        }
                        else {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        }
                      }
                      else {
                        puVar7[iVar4] = puVar7[img_row_4._4_4_];
                      }
                    }
                    else if (puVar6[iVar4] == '\0') {
                      if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                        puVar7[iVar4] = 0;
                      }
                      else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                        if (puVar6[iVar4 - lVar1] == '\0') {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                        }
                        else {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        }
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                      }
                    }
                    else if (puVar6[img_row_4._4_4_ + 1] == '\0') {
                      if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                        if (puVar6[iVar4 - lVar1] == '\0') {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                        }
                        else {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        }
                      }
                      else if (puVar6[iVar4 - lVar1] == '\0') {
                        if (puVar6[iVar4 + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3),
                                             *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                          puVar7[iVar4] = uVar5;
                        }
                        else {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                        }
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                      }
                    }
                    else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                      puVar7[iVar4] = puVar7[img_row_4._4_4_];
                    }
                    else if (puVar6[iVar4 - lVar1] == '\0') {
                      if (puVar6[iVar4 + lVar2] == '\0') {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                           puVar7[img_row_4._4_4_]);
                        puVar7[iVar4] = uVar5;
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                      }
                    }
                    else {
                      puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                    }
                    goto LAB_003d7cc1;
                  }
                  if (puVar6[iVar4] == '\0') {
                    if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                      puVar7[iVar4] = 0;
                      img_row_4._4_4_ = iVar4;
                      goto LAB_003d47b7;
                    }
                    if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                      puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                      img_row_4._4_4_ = iVar4;
                      goto LAB_003d584d;
                    }
                    if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                      if (puVar6[iVar4 - lVar1] == '\0') {
                        puVar7[iVar4] =
                             *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                           *(uint *)((long)puVar7 +
                                                    (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                        puVar7[iVar4] = uVar5;
                        img_row_4._4_4_ = iVar4;
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      goto LAB_003d554d;
                    }
                    if (puVar6[iVar4 - lVar1] != '\0') {
                      puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                      img_row_4._4_4_ = iVar4;
                      goto LAB_003d5129;
                    }
                    uVar5 = TTA::NewLabel();
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else {
                    if (puVar6[img_row_4._4_4_ + 1] != '\0') {
                      if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                        if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = puVar7[img_row_4._4_4_];
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d43a1;
                        }
                        if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                          puVar7[iVar4] = puVar7[img_row_4._4_4_];
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d6576;
                        }
                        if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                      (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                             puVar7[img_row_4._4_4_]);
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else if (puVar6[iVar4 - lVar1] == '\0') {
                          if (puVar6[iVar4 + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                               puVar7[img_row_4._4_4_]);
                            puVar7[iVar4] = uVar5;
                            img_row_4._4_4_ = iVar4;
                          }
                          else {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                        }
                        else {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                        }
                        goto LAB_003d554d;
                      }
                      if (puVar6[iVar4 - lVar1] == '\0') {
                        if (puVar6[iVar4 + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                             puVar7[img_row_4._4_4_]);
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                        }
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      goto LAB_003d5d0c;
                    }
                    if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                      if (puVar6[iVar4 - lVar1] == '\0') {
                        if (puVar6[iVar4 + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3),
                                             *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                        }
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      goto LAB_003d5d0c;
                    }
                    if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                      if (puVar6[iVar4 - lVar1] == '\0') {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      goto LAB_003d43a1;
                    }
                    if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                      if (puVar6[iVar4 - lVar1] == '\0') {
                        if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3),
                                             *(uint *)((long)puVar7 +
                                                      (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else if (puVar6[iVar4 + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3),
                                             *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                        }
                      }
                      else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                           *(uint *)((long)puVar7 +
                                                    (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                        puVar7[iVar4] = uVar5;
                        img_row_4._4_4_ = iVar4;
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      goto LAB_003d554d;
                    }
                    if (puVar6[iVar4 - lVar1] != '\0') {
                      puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                      img_row_4._4_4_ = iVar4;
                      goto LAB_003d5129;
                    }
                    puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                    img_row_4._4_4_ = iVar4;
                  }
LAB_003d4e58:
                  do {
                    iVar4 = img_row_4._4_4_ + 2;
                    if ((int)(uStack_18 - 2) <= iVar4) {
                      if ((int)(uStack_18 - 2) < iVar4) goto LAB_003d6bbc;
                      if (puVar6[iVar4] == '\0') {
                        if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = 0;
                        }
                        else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                        }
                        else {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        }
                      }
                      else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                        puVar7[iVar4] = puVar7[img_row_4._4_4_];
                      }
                      else {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                           puVar7[img_row_4._4_4_]);
                        puVar7[iVar4] = uVar5;
                      }
                      goto LAB_003d7cc1;
                    }
                    if (puVar6[iVar4] != '\0') goto code_r0x003d4ea6;
                    if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                      puVar7[iVar4] = 0;
                      img_row_4._4_4_ = iVar4;
LAB_003d47b7:
                      iVar4 = img_row_4._4_4_ + 2;
                      if ((int)(uStack_18 - 2) <= iVar4) {
                        if ((int)(uStack_18 - 2) < iVar4) {
                          if (puVar6[iVar4] == '\0') {
                            puVar7[iVar4] = 0;
                          }
                          else if (puVar6[iVar4 - lVar1] == '\0') {
                            if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                            }
                            else {
                              puVar7[iVar4] =
                                   *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                            }
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          }
                        }
                        else if (puVar6[iVar4] == '\0') {
                          if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                            puVar7[iVar4] = 0;
                          }
                          else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                            if (puVar6[iVar4 - lVar1] == '\0') {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                            }
                            else {
                              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            }
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          }
                        }
                        else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                          if (puVar6[iVar4 - lVar1] == '\0') {
                            if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                            }
                            else {
                              puVar7[iVar4] =
                                   *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                            }
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          }
                        }
                        else if (puVar6[iVar4 - lVar1] == '\0') {
                          if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          }
                          else if (puVar6[iVar4 + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                        (long)img_row_4._4_4_ * 4 + lVar3),
                                               *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                            puVar7[iVar4] = uVar5;
                          }
                          else {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                          }
                        }
                        else {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        }
                        goto LAB_003d7cc1;
                      }
                      if (puVar6[iVar4] == '\0') {
                        if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = 0;
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d47b7;
                        }
                        if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d584d;
                        }
                        if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                          if (puVar6[iVar4 - lVar1] == '\0') {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                               *(uint *)((long)puVar7 +
                                                        (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                            puVar7[iVar4] = uVar5;
                            img_row_4._4_4_ = iVar4;
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          goto LAB_003d554d;
                        }
                        if (puVar6[iVar4 - lVar1] == '\0') {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d4e58;
                        }
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      else {
                        if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                          if (puVar6[iVar4 - lVar1] == '\0') {
                            if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                              img_row_4._4_4_ = iVar4;
                            }
                            else if (puVar6[iVar4 + lVar2] == '\0') {
                              uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                          (long)img_row_4._4_4_ * 4 + lVar3),
                                                 *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                              puVar7[iVar4] = uVar5;
                              img_row_4._4_4_ = iVar4;
                            }
                            else {
                              puVar7[iVar4] =
                                   *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                              img_row_4._4_4_ = iVar4;
                            }
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          goto LAB_003d5d0c;
                        }
                        if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                          if (puVar6[iVar4 - lVar1] == '\0') {
                            if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                              img_row_4._4_4_ = iVar4;
                            }
                            else {
                              puVar7[iVar4] =
                                   *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                              img_row_4._4_4_ = iVar4;
                            }
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          goto LAB_003d43a1;
                        }
                        if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                          if (puVar6[iVar4 - lVar1] == '\0') {
                            if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              puVar7[iVar4] =
                                   *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3)
                              ;
                              img_row_4._4_4_ = iVar4;
                            }
                            else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                              uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                          (long)img_row_4._4_4_ * 4 + lVar3),
                                                 *(uint *)((long)puVar7 +
                                                          (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                              puVar7[iVar4] = uVar5;
                              img_row_4._4_4_ = iVar4;
                            }
                            else if (puVar6[iVar4 + lVar2] == '\0') {
                              uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                          (long)img_row_4._4_4_ * 4 + lVar3),
                                                 *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                              puVar7[iVar4] = uVar5;
                              img_row_4._4_4_ = iVar4;
                            }
                            else {
                              puVar7[iVar4] =
                                   *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                              img_row_4._4_4_ = iVar4;
                            }
                          }
                          else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                               *(uint *)((long)puVar7 +
                                                        (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                            puVar7[iVar4] = uVar5;
                            img_row_4._4_4_ = iVar4;
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          goto LAB_003d554d;
                        }
                        if (puVar6[iVar4 - lVar1] == '\0') {
                          if (puVar6[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                            uVar5 = TTA::NewLabel();
                            puVar7[iVar4] = uVar5;
                            img_row_4._4_4_ = iVar4;
                          }
                          else {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          goto LAB_003d4e58;
                        }
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
LAB_003d5129:
                      while( true ) {
                        iVar4 = img_row_4._4_4_ + 2;
                        if ((int)(uStack_18 - 2) <= iVar4) {
                          if ((int)(uStack_18 - 2) < iVar4) goto LAB_003d6bbc;
                          if (puVar6[iVar4] == '\0') {
                            if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                              puVar7[iVar4] = 0;
                            }
                            else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                              uVar5 = TTA::NewLabel();
                              puVar7[iVar4] = uVar5;
                            }
                            else {
                              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            }
                          }
                          else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                            puVar7[iVar4] = puVar7[img_row_4._4_4_];
                          }
                          else if (puVar6[iVar4 + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                               puVar7[img_row_4._4_4_]);
                            puVar7[iVar4] = uVar5;
                          }
                          else if (puVar6[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                        (long)img_row_4._4_4_ * 4 + lVar3),
                                               *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                            puVar7[iVar4] = uVar5;
                          }
                          else {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                          }
                          goto LAB_003d7cc1;
                        }
                        if (puVar6[iVar4] != '\0') break;
                        if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                          puVar7[iVar4] = 0;
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d47b7;
                        }
                        if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                          if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                            goto LAB_003d554d;
                          }
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d4e58;
                        }
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
LAB_003d584d:
                        while( true ) {
                          iVar4 = img_row_4._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar4) {
                            if ((int)(uStack_18 - 2) < iVar4) goto LAB_003d6bbc;
                            if (puVar6[iVar4] == '\0') {
                              if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                                puVar7[iVar4] = 0;
                              }
                              else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                                if (puVar6[iVar4 - lVar1] == '\0') {
                                  uVar5 = TTA::NewLabel();
                                  puVar7[iVar4] = uVar5;
                                }
                                else {
                                  puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                                }
                              }
                              else {
                                puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                              }
                            }
                            else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                              puVar7[iVar4] = puVar7[img_row_4._4_4_];
                            }
                            else if (puVar6[iVar4 - lVar1] == '\0') {
                              if (puVar6[iVar4 + lVar2] == '\0') {
                                uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3)
                                                   ,puVar7[img_row_4._4_4_]);
                                puVar7[iVar4] = uVar5;
                              }
                              else {
                                puVar7[iVar4] =
                                     *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                            }
                            else {
                              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            }
                            goto LAB_003d7cc1;
                          }
                          if (puVar6[iVar4] != '\0') {
                            if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                              if (puVar6[iVar4 - lVar1] == '\0') {
                                if (puVar6[iVar4 + lVar2] == '\0') {
                                  uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                              (long)iVar4 * 4 + lVar3),
                                                     puVar7[img_row_4._4_4_]);
                                  puVar7[iVar4] = uVar5;
                                  img_row_4._4_4_ = iVar4;
                                }
                                else {
                                  puVar7[iVar4] =
                                       *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                                  img_row_4._4_4_ = iVar4;
                                }
                              }
                              else {
                                puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                                img_row_4._4_4_ = iVar4;
                              }
                              goto LAB_003d5d0c;
                            }
                            if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                              puVar7[iVar4] = puVar7[img_row_4._4_4_];
                              img_row_4._4_4_ = iVar4;
                              goto LAB_003d43a1;
                            }
                            if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                              puVar7[iVar4] = puVar7[img_row_4._4_4_];
                              img_row_4._4_4_ = iVar4;
                              goto LAB_003d6576;
                            }
                            if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                              uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                          (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                                 puVar7[img_row_4._4_4_]);
                              puVar7[iVar4] = uVar5;
                              img_row_4._4_4_ = iVar4;
                            }
                            else if (puVar6[iVar4 - lVar1] == '\0') {
                              if (puVar6[iVar4 + lVar2] == '\0') {
                                uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3)
                                                   ,puVar7[img_row_4._4_4_]);
                                puVar7[iVar4] = uVar5;
                                img_row_4._4_4_ = iVar4;
                              }
                              else {
                                puVar7[iVar4] =
                                     *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                                img_row_4._4_4_ = iVar4;
                              }
                            }
                            else {
                              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                              img_row_4._4_4_ = iVar4;
                            }
                            goto LAB_003d554d;
                          }
                          if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                            puVar7[iVar4] = 0;
                            img_row_4._4_4_ = iVar4;
                            goto LAB_003d47b7;
                          }
                          if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') break;
                          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                        }
                        if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                          if (puVar6[iVar4 - lVar1] == '\0') {
                            puVar7[iVar4] =
                                 *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          else if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                            uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                               *(uint *)((long)puVar7 +
                                                        (long)(img_row_4._4_4_ + 4) * 4 + lVar3));
                            puVar7[iVar4] = uVar5;
                            img_row_4._4_4_ = iVar4;
                          }
                          else {
                            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                            img_row_4._4_4_ = iVar4;
                          }
                          goto LAB_003d554d;
                        }
                        if (puVar6[iVar4 - lVar1] == '\0') {
                          uVar5 = TTA::NewLabel();
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                          goto LAB_003d4e58;
                        }
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar6[iVar4 + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                             puVar7[img_row_4._4_4_]);
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else if (puVar6[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                          uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3),
                                             *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                          puVar7[iVar4] = uVar5;
                          img_row_4._4_4_ = iVar4;
                        }
                        else {
                          puVar7[iVar4] =
                               *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                          img_row_4._4_4_ = iVar4;
                        }
                        goto LAB_003d5d0c;
                      }
                      if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                        puVar7[iVar4] = puVar7[img_row_4._4_4_];
                        img_row_4._4_4_ = iVar4;
                        goto LAB_003d43a1;
                      }
                      if (puVar6[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                        puVar7[iVar4] = puVar7[img_row_4._4_4_];
                        img_row_4._4_4_ = iVar4;
                        goto LAB_003d6576;
                      }
                      if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                    (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                           puVar7[img_row_4._4_4_]);
                        puVar7[iVar4] = uVar5;
                        img_row_4._4_4_ = iVar4;
                      }
                      else if (puVar6[iVar4 + lVar2] == '\0') {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                           puVar7[img_row_4._4_4_]);
                        puVar7[iVar4] = uVar5;
                        img_row_4._4_4_ = iVar4;
                      }
                      else if (puVar6[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                        uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                    (long)img_row_4._4_4_ * 4 + lVar3),
                                           *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                        puVar7[iVar4] = uVar5;
                        img_row_4._4_4_ = iVar4;
                      }
                      else {
                        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                        img_row_4._4_4_ = iVar4;
                      }
                      goto LAB_003d554d;
                    }
                    if (puVar6[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                      puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
                      img_row_4._4_4_ = iVar4;
                      goto LAB_003d584d;
                    }
                    if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                      puVar7[iVar4] =
                           *(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                      img_row_4._4_4_ = iVar4;
                      goto LAB_003d554d;
                    }
                    uVar5 = TTA::NewLabel();
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  } while( true );
                }
                if (puVar6[img_row_4._4_4_ + 3] == '\0') {
                  puVar7[iVar4] = puVar7[img_row_4._4_4_];
                  img_row_4._4_4_ = iVar4;
                  goto LAB_003d43a1;
                }
                if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                  if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 +
                                                (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else if (puVar6[iVar4 + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else if (puVar6[img_row_4._4_4_ - lVar1] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),
                                       puVar7[img_row_4._4_4_]);
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else if (puVar6[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3),
                                       *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3));
                    puVar7[iVar4] = uVar5;
                    img_row_4._4_4_ = iVar4;
                  }
                  else {
                    puVar7[iVar4] = *(uint *)((long)puVar7 + (long)img_row_4._4_4_ * 4 + lVar3);
                    img_row_4._4_4_ = iVar4;
                  }
                  goto LAB_003d554d;
                }
                puVar7[iVar4] = puVar7[img_row_4._4_4_];
                img_row_4._4_4_ = iVar4;
              } while( true );
            }
            if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
              uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                 puVar7[img_row_4._4_4_]);
              puVar7[iVar4] = uVar5;
              img_row_4._4_4_ = iVar4;
            }
            else {
              puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
              img_row_4._4_4_ = iVar4;
            }
          }
        } while( true );
      }
      if ((int)(uStack_18 - 2) < iVar4) {
        if (puVar6[iVar4] == '\0') {
          puVar7[iVar4] = 0;
        }
        else if (puVar6[iVar4 - lVar1] == '\0') {
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
        }
        else {
          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
        }
      }
      else if (puVar6[iVar4] == '\0') {
        if (puVar6[img_row_4._4_4_ + 3] == '\0') {
          puVar7[iVar4] = 0;
        }
        else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
          if (puVar6[iVar4 - lVar1] == '\0') {
            uVar5 = TTA::NewLabel();
            puVar7[iVar4] = uVar5;
          }
          else {
            puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
          }
        }
        else {
          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
        }
      }
      else if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
        if (puVar6[iVar4 - lVar1] == '\0') {
          uVar5 = TTA::NewLabel();
          puVar7[iVar4] = uVar5;
        }
        else {
          puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
        }
      }
      else {
        puVar7[iVar4] = *(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3);
      }
    }
  }
LAB_003d7cc1:
  uVar5 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar5;
  for (img_row_4._0_4_ = 0; (int)img_row_4 < e_cols; img_row_4._0_4_ = (int)img_row_4 + 2) {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_4);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_4);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iLabel_1 = 0; iLabel_1 < (int)local_24; iLabel_1 = iLabel_1 + 2) {
      if ((int)puVar7[iLabel_1] < 1) {
        puVar7[iLabel_1] = 0;
        puVar7[iLabel_1 + 1] = 0;
        *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar2) = 0;
        *(undefined4 *)((long)puVar7 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
      }
      else {
        uVar5 = TTA::GetLabel(puVar7[iLabel_1]);
        if (puVar6[iLabel_1] == '\0') {
          puVar7[iLabel_1] = 0;
        }
        else {
          puVar7[iLabel_1] = uVar5;
        }
        if (puVar6[iLabel_1 + 1] == '\0') {
          puVar7[iLabel_1 + 1] = 0;
        }
        else {
          puVar7[iLabel_1 + 1] = uVar5;
        }
        if (puVar6[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar7 + (long)iLabel_1 * 4 + lVar2) = uVar5;
        }
        if (puVar6[(iLabel_1 + 1) + lVar1] == '\0') {
          *(undefined4 *)((long)puVar7 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar7 + (long)(iLabel_1 + 1) * 4 + lVar2) = uVar5;
        }
      }
    }
    if ((local_25 & 1) != 0) {
      if ((int)puVar7[iLabel_1] < 1) {
        puVar7[iLabel_1] = 0;
        *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar2) = 0;
      }
      else {
        uVar5 = TTA::GetLabel(puVar7[iLabel_1]);
        if (puVar6[iLabel_1] == '\0') {
          puVar7[iLabel_1] = 0;
        }
        else {
          puVar7[iLabel_1] = uVar5;
        }
        if (puVar6[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar7 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar7 + (long)iLabel_1 * 4 + lVar2) = uVar5;
        }
      }
    }
  }
  if ((o_cols & 1U) != 0) {
    puVar6 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_4);
    puVar7 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_4);
    for (iLabel_3 = 0; iLabel_3 < (int)local_24; iLabel_3 = iLabel_3 + 2) {
      if ((int)puVar7[iLabel_3] < 1) {
        puVar7[iLabel_3] = 0;
        puVar7[iLabel_3 + 1] = 0;
      }
      else {
        uVar5 = TTA::GetLabel(puVar7[iLabel_3]);
        if (puVar6[iLabel_3] == '\0') {
          puVar7[iLabel_3] = 0;
        }
        else {
          puVar7[iLabel_3] = uVar5;
        }
        if (puVar6[iLabel_3 + 1] == '\0') {
          puVar7[iLabel_3 + 1] = 0;
        }
        else {
          puVar7[iLabel_3 + 1] = uVar5;
        }
      }
    }
    if ((local_25 & 1) != 0) {
      if ((int)puVar7[iLabel_3] < 1) {
        puVar7[iLabel_3] = 0;
      }
      else {
        uVar5 = TTA::GetLabel(puVar7[iLabel_3]);
        if (puVar6[iLabel_3] == '\0') {
          puVar7[iLabel_3] = 0;
        }
        else {
          puVar7[iLabel_3] = uVar5;
        }
      }
    }
  }
  TTA::Dealloc();
  return;
code_r0x003ca6bb:
  if (puVar9[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_ + 4],puVar7[img_row_3._4_4_]);
    puVar7[iVar4] = uVar5;
    img_row_3._4_4_ = iVar4;
  }
  else if (puVar9[iVar4 - lVar1] == '\0') {
    uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
    puVar7[iVar4] = uVar5;
    img_row_3._4_4_ = iVar4;
  }
  else if (puVar9[img_row_3._4_4_] == '\0') {
    uVar5 = TTA::Merge(puVar8[iVar4],puVar7[img_row_3._4_4_]);
    puVar7[iVar4] = uVar5;
    img_row_3._4_4_ = iVar4;
  }
  else if (puVar9[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
    uVar5 = TTA::Merge(puVar8[img_row_3._4_4_],puVar8[iVar4]);
    puVar7[iVar4] = uVar5;
    img_row_3._4_4_ = iVar4;
  }
  else {
    puVar7[iVar4] = puVar8[img_row_3._4_4_];
    img_row_3._4_4_ = iVar4;
  }
  goto LAB_003c8690;
code_r0x003ca487:
  uVar5 = TTA::NewLabel();
  puVar7[iVar4] = uVar5;
  img_row_3._4_4_ = iVar4;
  goto LAB_003c6f3e;
code_r0x003d4ea6:
  if (puVar6[(img_row_4._4_4_ + 3) - lVar1] == '\0') goto LAB_003d4f06;
  uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),puVar7[img_row_4._4_4_]);
  puVar7[iVar4] = uVar5;
  img_row_4._4_4_ = iVar4;
  goto LAB_003d5d0c;
LAB_003d4f06:
  if (puVar6[img_row_4._4_4_ + 3] == '\0') {
    puVar7[iVar4] = puVar7[img_row_4._4_4_];
    img_row_4._4_4_ = iVar4;
    goto LAB_003d43a1;
  }
  if (puVar6[(img_row_4._4_4_ + 4) - lVar1] != '\0') goto code_r0x003d4f46;
  puVar7[iVar4] = puVar7[img_row_4._4_4_];
  img_row_4._4_4_ = iVar4;
  goto LAB_003d6576;
code_r0x003d4f46:
  if (puVar6[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                       puVar7[img_row_4._4_4_]);
    puVar7[iVar4] = uVar5;
    img_row_4._4_4_ = iVar4;
  }
  else {
    uVar5 = TTA::Merge(*(uint *)((long)puVar7 + (long)iVar4 * 4 + lVar3),puVar7[img_row_4._4_4_]);
    puVar7[iVar4] = uVar5;
    img_row_4._4_4_ = iVar4;
  }
  goto LAB_003d554d;
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        int e_rows = h & 0xfffffffe;
        bool o_rows = h % 2 == 1;
        int e_cols = w & 0xfffffffe;
        bool o_cols = w % 2 == 1;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan

        // Define Conditions and Actions
        {
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

            // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
                               // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
                               //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
                               // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
                               // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
                               // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
                               // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
                               //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
                               // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
                               // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
                               // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
                               // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
                               // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
                               // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
                               //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
                               //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
        }

        if (h == 1) {
            // Single line
            int r = 0;
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
            int c = -2;
#include "labeling_tagliatelle_2021_sl_forest.inc.h"
        }
        else {
            // More than one line

            // First couple of lines
            {
                int r = 0;
                const unsigned char* const img_row = img_.ptr<unsigned char>(0);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
                int c = -2;

#include "labeling_tagliatelle_2021_fl_forest.inc.h"
            }

            // Every other line but the last one if image has an odd number of rows
            for (int r = 2; r < e_rows; r += 2) {
                // Get rows pointer
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

                int c = -2;
                goto cl_tree_0;

#include "labeling_tagliatelle_2021_cl_forest.inc.h"
            }

            // Last line (in case the rows are odd)
            if (o_rows)
            {
                int r = h - 1;
                const unsigned char* const img_row = img_.ptr<unsigned char>(r);
                const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
                const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
                unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
                unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
                int c = -2;
#include "labeling_tagliatelle_2021_ll_forest.inc.h"
            }
        }


        // Undef Conditions and Actions
        {
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

    }